

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  int iVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  long lVar67;
  undefined1 auVar68 [32];
  byte bVar69;
  uint uVar70;
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  long lVar74;
  Geometry *geometry;
  long lVar75;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  ulong uVar76;
  bool bVar77;
  byte bVar78;
  float fVar79;
  float fVar126;
  float fVar128;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar80;
  undefined1 auVar86 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar132;
  undefined4 uVar133;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar158;
  undefined1 auVar159 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar160 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  RTCFilterFunctionNArguments args;
  int local_55c;
  Ray *local_558;
  Primitive *local_550;
  ulong local_548;
  ulong local_540;
  Precalculations *local_538;
  RTCFilterFunctionNArguments local_530;
  undefined8 local_500;
  undefined4 local_4f8;
  float local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  uint local_4e4;
  uint local_4e0;
  Geometry *local_4c8;
  RayQueryContext *local_4c0;
  ulong local_4b8;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_450 [16];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar14 = prim[1];
  uVar73 = (ulong)(byte)PVar14;
  fVar158 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  local_538 = pre;
  auVar139 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  fVar147 = fVar158 * auVar139._0_4_;
  fVar132 = fVar158 * (ray->dir).field_0.m128[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar81);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar91 = vpmovsxbd_avx2(auVar177);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar73 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar98 = vpmovsxbd_avx2(auVar9);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar95 = vcvtdq2ps_avx(auVar98);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar73 + 6);
  auVar94 = vpmovsxbd_avx2(auVar10);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar76 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar76 + 6);
  auVar96 = vpmovsxbd_avx2(auVar11);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar76 + uVar73 + 6);
  auVar101 = vpmovsxbd_avx2(auVar12);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar71 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar89 = vpmovsxbd_avx2(auVar13);
  auVar97 = vcvtdq2ps_avx(auVar89);
  auVar171._4_4_ = fVar132;
  auVar171._0_4_ = fVar132;
  auVar171._8_4_ = fVar132;
  auVar171._12_4_ = fVar132;
  auVar171._16_4_ = fVar132;
  auVar171._20_4_ = fVar132;
  auVar171._24_4_ = fVar132;
  auVar171._28_4_ = fVar132;
  auVar174._8_4_ = 1;
  auVar174._0_8_ = 0x100000001;
  auVar174._12_4_ = 1;
  auVar174._16_4_ = 1;
  auVar174._20_4_ = 1;
  auVar174._24_4_ = 1;
  auVar174._28_4_ = 1;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar100 = ZEXT1632(CONCAT412(fVar158 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar158 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar158 * (ray->dir).field_0.m128[1],fVar132))));
  auVar99 = vpermps_avx2(auVar174,auVar100);
  auVar88 = vpermps_avx512vl(auVar87,auVar100);
  fVar132 = auVar88._0_4_;
  fVar136 = auVar88._4_4_;
  auVar100._4_4_ = fVar136 * auVar91._4_4_;
  auVar100._0_4_ = fVar132 * auVar91._0_4_;
  fVar137 = auVar88._8_4_;
  auVar100._8_4_ = fVar137 * auVar91._8_4_;
  fVar138 = auVar88._12_4_;
  auVar100._12_4_ = fVar138 * auVar91._12_4_;
  fVar161 = auVar88._16_4_;
  auVar100._16_4_ = fVar161 * auVar91._16_4_;
  fVar162 = auVar88._20_4_;
  auVar100._20_4_ = fVar162 * auVar91._20_4_;
  fVar163 = auVar88._24_4_;
  auVar100._24_4_ = fVar163 * auVar91._24_4_;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar94._4_4_ * fVar136;
  auVar98._0_4_ = auVar94._0_4_ * fVar132;
  auVar98._8_4_ = auVar94._8_4_ * fVar137;
  auVar98._12_4_ = auVar94._12_4_ * fVar138;
  auVar98._16_4_ = auVar94._16_4_ * fVar161;
  auVar98._20_4_ = auVar94._20_4_ * fVar162;
  auVar98._24_4_ = auVar94._24_4_ * fVar163;
  auVar98._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar97._4_4_ * fVar136;
  auVar89._0_4_ = auVar97._0_4_ * fVar132;
  auVar89._8_4_ = auVar97._8_4_ * fVar137;
  auVar89._12_4_ = auVar97._12_4_ * fVar138;
  auVar89._16_4_ = auVar97._16_4_ * fVar161;
  auVar89._20_4_ = auVar97._20_4_ * fVar162;
  auVar89._24_4_ = auVar97._24_4_ * fVar163;
  auVar89._28_4_ = auVar88._28_4_;
  auVar83 = vfmadd231ps_fma(auVar100,auVar99,auVar90);
  auVar81 = vfmadd231ps_fma(auVar98,auVar99,auVar95);
  auVar177 = vfmadd231ps_fma(auVar89,auVar101,auVar99);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar171,auVar93);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar171,auVar92);
  auVar177 = vfmadd231ps_fma(ZEXT1632(auVar177),auVar96,auVar171);
  auVar172._4_4_ = fVar147;
  auVar172._0_4_ = fVar147;
  auVar172._8_4_ = fVar147;
  auVar172._12_4_ = fVar147;
  auVar172._16_4_ = fVar147;
  auVar172._20_4_ = fVar147;
  auVar172._24_4_ = fVar147;
  auVar172._28_4_ = fVar147;
  auVar89 = ZEXT1632(CONCAT412(fVar158 * auVar139._12_4_,
                               CONCAT48(fVar158 * auVar139._8_4_,
                                        CONCAT44(fVar158 * auVar139._4_4_,fVar147))));
  auVar98 = vpermps_avx2(auVar174,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  fVar158 = auVar89._0_4_;
  fVar132 = auVar89._4_4_;
  auVar99._4_4_ = fVar132 * auVar91._4_4_;
  auVar99._0_4_ = fVar158 * auVar91._0_4_;
  fVar136 = auVar89._8_4_;
  auVar99._8_4_ = fVar136 * auVar91._8_4_;
  fVar137 = auVar89._12_4_;
  auVar99._12_4_ = fVar137 * auVar91._12_4_;
  fVar138 = auVar89._16_4_;
  auVar99._16_4_ = fVar138 * auVar91._16_4_;
  fVar161 = auVar89._20_4_;
  auVar99._20_4_ = fVar161 * auVar91._20_4_;
  fVar162 = auVar89._24_4_;
  auVar99._24_4_ = fVar162 * auVar91._24_4_;
  auVar99._28_4_ = 1;
  auVar87._4_4_ = auVar94._4_4_ * fVar132;
  auVar87._0_4_ = auVar94._0_4_ * fVar158;
  auVar87._8_4_ = auVar94._8_4_ * fVar136;
  auVar87._12_4_ = auVar94._12_4_ * fVar137;
  auVar87._16_4_ = auVar94._16_4_ * fVar138;
  auVar87._20_4_ = auVar94._20_4_ * fVar161;
  auVar87._24_4_ = auVar94._24_4_ * fVar162;
  auVar87._28_4_ = auVar91._28_4_;
  auVar94._4_4_ = auVar97._4_4_ * fVar132;
  auVar94._0_4_ = auVar97._0_4_ * fVar158;
  auVar94._8_4_ = auVar97._8_4_ * fVar136;
  auVar94._12_4_ = auVar97._12_4_ * fVar137;
  auVar94._16_4_ = auVar97._16_4_ * fVar138;
  auVar94._20_4_ = auVar97._20_4_ * fVar161;
  auVar94._24_4_ = auVar97._24_4_ * fVar162;
  auVar94._28_4_ = auVar89._28_4_;
  auVar8 = vfmadd231ps_fma(auVar99,auVar98,auVar90);
  auVar9 = vfmadd231ps_fma(auVar87,auVar98,auVar95);
  auVar10 = vfmadd231ps_fma(auVar94,auVar98,auVar101);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar172,auVar93);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar172,auVar92);
  auVar164._8_4_ = 0x7fffffff;
  auVar164._0_8_ = 0x7fffffff7fffffff;
  auVar164._12_4_ = 0x7fffffff;
  auVar164._16_4_ = 0x7fffffff;
  auVar164._20_4_ = 0x7fffffff;
  auVar164._24_4_ = 0x7fffffff;
  auVar164._28_4_ = 0x7fffffff;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar172,auVar96);
  auVar93 = vandps_avx(ZEXT1632(auVar83),auVar164);
  auVar160._8_4_ = 0x219392ef;
  auVar160._0_8_ = 0x219392ef219392ef;
  auVar160._12_4_ = 0x219392ef;
  auVar160._16_4_ = 0x219392ef;
  auVar160._20_4_ = 0x219392ef;
  auVar160._24_4_ = 0x219392ef;
  auVar160._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar93,auVar160,1);
  bVar77 = (bool)((byte)uVar76 & 1);
  auVar88._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._0_4_;
  bVar77 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._4_4_;
  bVar77 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._8_4_;
  bVar77 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar81),auVar164);
  uVar76 = vcmpps_avx512vl(auVar93,auVar160,1);
  bVar77 = (bool)((byte)uVar76 & 1);
  auVar112._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._0_4_;
  bVar77 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._4_4_;
  bVar77 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._8_4_;
  bVar77 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar81._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar177),auVar164);
  uVar76 = vcmpps_avx512vl(auVar93,auVar160,1);
  bVar77 = (bool)((byte)uVar76 & 1);
  auVar93._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar177._0_4_;
  bVar77 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar177._4_4_;
  bVar77 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar177._8_4_;
  bVar77 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar177._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar88,auVar90,auVar91);
  auVar83 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar112);
  auVar92 = vfnmadd213ps_avx512vl(auVar112,auVar90,auVar91);
  auVar81 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar177 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar8));
  auVar96._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar96._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar96._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar96._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar96._16_4_ = auVar93._16_4_ * 0.0;
  auVar96._20_4_ = auVar93._20_4_ * 0.0;
  auVar96._24_4_ = auVar93._24_4_ * 0.0;
  auVar96._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar8));
  auVar94 = vpbroadcastd_avx512vl();
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar115._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar115._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar115._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar115._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar115._16_4_ = auVar93._16_4_ * 0.0;
  auVar115._20_4_ = auVar93._20_4_ * 0.0;
  auVar115._24_4_ = auVar93._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar14 * 0x10 + uVar73 * -2 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar9));
  auVar101._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar101._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar101._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar90);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar9));
  auVar114._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar114._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar114._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar114._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar114._16_4_ = auVar93._16_4_ * 0.0;
  auVar114._20_4_ = auVar93._20_4_ * 0.0;
  auVar114._24_4_ = auVar93._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + uVar73 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar10));
  auVar97._4_4_ = auVar93._4_4_ * auVar177._4_4_;
  auVar97._0_4_ = auVar93._0_4_ * auVar177._0_4_;
  auVar97._8_4_ = auVar93._8_4_ * auVar177._8_4_;
  auVar97._12_4_ = auVar93._12_4_ * auVar177._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar10));
  auVar113._0_4_ = auVar177._0_4_ * auVar93._0_4_;
  auVar113._4_4_ = auVar177._4_4_ * auVar93._4_4_;
  auVar113._8_4_ = auVar177._8_4_ * auVar93._8_4_;
  auVar113._12_4_ = auVar177._12_4_ * auVar93._12_4_;
  auVar113._16_4_ = auVar93._16_4_ * 0.0;
  auVar113._20_4_ = auVar93._20_4_ * 0.0;
  auVar113._24_4_ = auVar93._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar96,auVar115);
  auVar90 = vpminsd_avx2(auVar101,auVar114);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90 = vpminsd_avx2(auVar97,auVar113);
  uVar133 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar91._4_4_ = uVar133;
  auVar91._0_4_ = uVar133;
  auVar91._8_4_ = uVar133;
  auVar91._12_4_ = uVar133;
  auVar91._16_4_ = uVar133;
  auVar91._20_4_ = uVar133;
  auVar91._24_4_ = uVar133;
  auVar91._28_4_ = uVar133;
  auVar90 = vmaxps_avx512vl(auVar90,auVar91);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar90);
  auVar93 = vpmaxsd_avx2(auVar96,auVar115);
  auVar90 = vpmaxsd_avx2(auVar101,auVar114);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar90 = vpmaxsd_avx2(auVar97,auVar113);
  fVar158 = ray->tfar;
  auVar92._4_4_ = fVar158;
  auVar92._0_4_ = fVar158;
  auVar92._8_4_ = fVar158;
  auVar92._12_4_ = fVar158;
  auVar92._16_4_ = fVar158;
  auVar92._20_4_ = fVar158;
  auVar92._24_4_ = fVar158;
  auVar92._28_4_ = fVar158;
  auVar90 = vminps_avx512vl(auVar90,auVar92);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar95);
  uVar25 = vpcmpgtd_avx512vl(auVar94,_DAT_01fe9900);
  uVar24 = vcmpps_avx512vl(local_80,auVar93,2);
  if ((byte)((byte)uVar24 & (byte)uVar25) == 0) {
    bVar77 = false;
  }
  else {
    uVar76 = (ulong)(byte)((byte)uVar24 & (byte)uVar25);
    local_558 = ray;
    local_550 = prim;
    do {
      lVar75 = 0;
      for (uVar71 = uVar76; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        lVar75 = lVar75 + 1;
      }
      local_540 = (ulong)*(uint *)(local_550 + 2);
      pGVar16 = (context->scene->geometries).items[*(uint *)(local_550 + 2)].ptr;
      local_4b8 = (ulong)*(uint *)(local_550 + lVar75 * 4 + 6);
      uVar71 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                               (ulong)*(uint *)(local_550 + lVar75 * 4 + 6) *
                               pGVar16[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar72 = (long)pGVar16[1].intersectionFilterN * uVar71;
      lVar75 = *(long *)&pGVar16[1].time_range.upper;
      local_4a0 = *(undefined1 (*) [16])(lVar75 + lVar72);
      lVar74 = (long)pGVar16[1].intersectionFilterN * (uVar71 + 1);
      _local_310 = *(undefined1 (*) [16])(lVar75 + lVar74);
      iVar15 = (int)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar67 = (long)iVar15 * 0x44;
      auVar139._8_4_ = 0xbeaaaaab;
      auVar139._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar139._12_4_ = 0xbeaaaaab;
      local_490 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                    (pGVar16[2].intersectionFilterN +
                                    uVar71 * (long)pGVar16[2].pointQueryFunc),local_4a0,auVar139);
      local_4b0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar16[2].intersectionFilterN +
                                   (long)pGVar16[2].pointQueryFunc * (uVar71 + 1)),_local_310,
                                  auVar139);
      aVar3 = (local_558->org).field_0;
      auVar142 = local_4a0;
      auVar81 = vsubps_avx(local_4a0,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar82._4_4_ = uVar133;
      auVar82._0_4_ = uVar133;
      auVar82._8_4_ = uVar133;
      auVar82._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar81,auVar81,0x55);
      aVar4 = (local_538->ray_space).vx.field_0;
      aVar5 = (local_538->ray_space).vy.field_0;
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      fVar158 = (local_538->ray_space).vz.field_0.m128[0];
      fVar132 = (local_538->ray_space).vz.field_0.m128[1];
      fVar136 = (local_538->ray_space).vz.field_0.m128[2];
      fVar137 = (local_538->ray_space).vz.field_0.m128[3];
      auVar86._0_4_ = auVar81._0_4_ * fVar158;
      auVar86._4_4_ = auVar81._4_4_ * fVar132;
      auVar86._8_4_ = auVar81._8_4_ * fVar136;
      auVar86._12_4_ = auVar81._12_4_ * fVar137;
      auVar83 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar83);
      auVar177 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar82);
      auVar81 = vsubps_avx(local_490,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar140._4_4_ = uVar133;
      auVar140._0_4_ = uVar133;
      auVar140._8_4_ = uVar133;
      auVar140._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar169._0_4_ = auVar81._0_4_ * fVar158;
      auVar169._4_4_ = auVar81._4_4_ * fVar132;
      auVar169._8_4_ = auVar81._8_4_ * fVar136;
      auVar169._12_4_ = auVar81._12_4_ * fVar137;
      auVar83 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar5,auVar83);
      auVar8 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar140);
      auVar81 = vsubps_avx(local_4b0,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar84._4_4_ = uVar133;
      auVar84._0_4_ = uVar133;
      auVar84._8_4_ = uVar133;
      auVar84._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar170._0_4_ = auVar81._0_4_ * fVar158;
      auVar170._4_4_ = auVar81._4_4_ * fVar132;
      auVar170._8_4_ = auVar81._8_4_ * fVar136;
      auVar170._12_4_ = auVar81._12_4_ * fVar137;
      auVar83 = vfmadd231ps_fma(auVar170,(undefined1  [16])aVar5,auVar83);
      auVar9 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar84);
      local_2e0 = ZEXT1632((undefined1  [16])aVar3);
      auVar81 = vsubps_avx(_local_310,(undefined1  [16])aVar3);
      uVar133 = auVar81._0_4_;
      auVar85._4_4_ = uVar133;
      auVar85._0_4_ = uVar133;
      auVar85._8_4_ = uVar133;
      auVar85._12_4_ = uVar133;
      auVar83 = vshufps_avx(auVar81,auVar81,0x55);
      auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar173._0_4_ = auVar81._0_4_ * fVar158;
      auVar173._4_4_ = auVar81._4_4_ * fVar132;
      auVar173._8_4_ = auVar81._8_4_ * fVar136;
      auVar173._12_4_ = auVar81._12_4_ * fVar137;
      auVar83 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar83);
      auVar10 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar85);
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar67);
      uVar133 = auVar177._0_4_;
      local_340._4_4_ = uVar133;
      local_340._0_4_ = uVar133;
      local_340._8_4_ = uVar133;
      local_340._12_4_ = uVar133;
      local_340._16_4_ = uVar133;
      local_340._20_4_ = uVar133;
      local_340._24_4_ = uVar133;
      local_340._28_4_ = uVar133;
      auVar134._8_4_ = 1;
      auVar134._0_8_ = 0x100000001;
      auVar134._12_4_ = 1;
      auVar134._16_4_ = 1;
      auVar134._20_4_ = 1;
      auVar134._24_4_ = 1;
      auVar134._28_4_ = 1;
      local_360 = vpermps_avx2(auVar134,ZEXT1632(auVar177));
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x484);
      local_400 = vbroadcastss_avx512vl(auVar8);
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x908);
      local_380 = vpermps_avx512vl(auVar134,ZEXT1632(auVar8));
      local_420 = vbroadcastss_avx512vl(auVar9);
      local_440 = vpermps_avx512vl(auVar134,ZEXT1632(auVar9));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0xd8c);
      uVar133 = auVar10._0_4_;
      auVar159._4_4_ = uVar133;
      auVar159._0_4_ = uVar133;
      auVar159._8_4_ = uVar133;
      auVar159._12_4_ = uVar133;
      local_3a0._16_4_ = uVar133;
      local_3a0._0_16_ = auVar159;
      local_3a0._20_4_ = uVar133;
      local_3a0._24_4_ = uVar133;
      local_3a0._28_4_ = uVar133;
      local_3c0 = vpermps_avx512vl(auVar134,ZEXT1632(auVar10));
      auVar95 = vmulps_avx512vl(local_3a0,auVar92);
      auVar94 = vmulps_avx512vl(local_3c0,auVar92);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_420);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_440);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_400);
      auVar96 = vfmadd231ps_avx512vl(auVar94,auVar90,local_380);
      auVar11 = vfmadd231ps_fma(auVar95,auVar93,local_340);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar67);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x484);
      auVar12 = vfmadd231ps_fma(auVar96,auVar93,local_360);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x908);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0xd8c);
      auVar183 = ZEXT3264(local_3a0);
      auVar97 = vmulps_avx512vl(local_3a0,auVar101);
      auVar186 = ZEXT3264(local_3c0);
      auVar98 = vmulps_avx512vl(local_3c0,auVar101);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_420);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_440);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_380);
      auVar13 = vfmadd231ps_fma(auVar97,auVar95,local_340);
      auVar139 = vfmadd231ps_fma(auVar98,auVar95,local_360);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar13),ZEXT1632(auVar11));
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar139),ZEXT1632(auVar12));
      auVar89 = vmulps_avx512vl(ZEXT1632(auVar12),auVar97);
      auVar99 = vmulps_avx512vl(ZEXT1632(auVar11),auVar98);
      auVar89 = vsubps_avx512vl(auVar89,auVar99);
      auVar83 = vshufps_avx(local_490,local_490,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar83);
      auVar83 = vshufps_avx(local_4b0,local_4b0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar83);
      _local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar75 + 0xc + lVar74)));
      auVar99 = vmulps_avx512vl(_local_e0,auVar92);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,local_c0);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,local_a0);
      local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar75 + 0xc + lVar72)));
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,local_100);
      auVar100 = vmulps_avx512vl(_local_e0,auVar101);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_c0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar94,local_a0);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,local_100);
      auVar87 = vmulps_avx512vl(auVar98,auVar98);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar97);
      auVar88 = vmaxps_avx512vl(auVar99,auVar100);
      auVar88 = vmulps_avx512vl(auVar88,auVar88);
      auVar87 = vmulps_avx512vl(auVar88,auVar87);
      auVar89 = vmulps_avx512vl(auVar89,auVar89);
      uVar24 = vcmpps_avx512vl(auVar89,auVar87,2);
      auVar83 = vinsertps_avx512f(auVar177,local_100._0_16_,0x30);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar82 = vandps_avx512vl(auVar83,auVar81);
      auVar140 = local_490;
      auVar83 = vblendps_avx(auVar8,local_490,8);
      auVar83 = vandps_avx512vl(auVar83,auVar81);
      auVar84 = vmaxps_avx512vl(auVar82,auVar83);
      auVar82 = local_4b0;
      auVar83 = vblendps_avx(auVar9,local_4b0,8);
      auVar85 = vandps_avx512vl(auVar83,auVar81);
      auVar83 = vinsertps_avx512f(auVar10,local_e0._0_16_,0x30);
      auVar83 = vandps_avx512vl(auVar83,auVar81);
      auVar83 = vmaxps_avx512vl(auVar85,auVar83);
      auVar83 = vmaxps_avx(auVar84,auVar83);
      auVar81 = vmovshdup_avx(auVar83);
      auVar81 = vmaxss_avx(auVar81,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar81);
      local_300._0_4_ = (undefined4)iVar15;
      register0x00001444 = auVar177._4_12_;
      auVar167._4_4_ = local_300._0_4_;
      auVar167._0_4_ = local_300._0_4_;
      auVar167._8_4_ = local_300._0_4_;
      auVar167._12_4_ = local_300._0_4_;
      auVar167._16_4_ = local_300._0_4_;
      auVar167._20_4_ = local_300._0_4_;
      auVar167._24_4_ = local_300._0_4_;
      auVar167._28_4_ = local_300._0_4_;
      uVar25 = vcmpps_avx512vl(auVar167,_DAT_01faff40,0xe);
      bVar78 = (byte)uVar24 & (byte)uVar25;
      auVar83 = vmulss_avx512f(auVar83,ZEXT416(0x35000000));
      auVar166._8_4_ = 2;
      auVar166._0_8_ = 0x200000002;
      auVar166._12_4_ = 2;
      auVar166._16_4_ = 2;
      auVar166._20_4_ = 2;
      auVar166._24_4_ = 2;
      auVar166._28_4_ = 2;
      local_3e0 = vpermps_avx512vl(auVar166,ZEXT1632(auVar177));
      auVar180 = ZEXT3264(local_3e0);
      local_480 = vpermps_avx512vl(auVar166,ZEXT1632(auVar8));
      auVar181 = ZEXT3264(local_480);
      local_120 = vpermps_avx512vl(auVar166,ZEXT1632(auVar9));
      local_140 = vpermps_avx512vl(auVar166,ZEXT1632(auVar10));
      local_2a0 = auVar83._0_4_;
      uStack_29c = auVar83._4_4_;
      uStack_298 = auVar83._8_4_;
      uStack_294 = auVar83._12_4_;
      if (bVar78 == 0) {
        bVar77 = false;
        auVar83 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        auVar178 = ZEXT1664(auVar83);
        auVar176 = ZEXT3264(local_340);
        auVar187 = ZEXT3264(local_360);
        auVar185 = ZEXT3264(local_400);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar179 = ZEXT3264(auVar93);
        auVar184 = ZEXT3264(local_380);
        auVar182 = ZEXT3264(local_420);
        auVar188 = ZEXT3264(local_440);
        local_4b0 = auVar82;
        local_4a0 = auVar142;
        local_490 = auVar140;
      }
      else {
        auVar101 = vmulps_avx512vl(local_140,auVar101);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar101);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_480,auVar96);
        auVar94 = vfmadd213ps_avx512vl(auVar95,local_3e0,auVar94);
        auVar92 = vmulps_avx512vl(local_140,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar92);
        auVar96 = vfmadd213ps_avx512vl(auVar90,local_480,auVar91);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 + 0x1f9c);
        auVar96 = vfmadd213ps_avx512vl(auVar93,local_3e0,auVar96);
        auVar93 = vmulps_avx512vl(local_3a0,auVar95);
        auVar101 = vmulps_avx512vl(local_3c0,auVar95);
        auVar95 = vmulps_avx512vl(local_140,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,local_420);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,local_440);
        auVar92 = vfmadd231ps_avx512vl(auVar95,local_120,auVar92);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_400);
        auVar95 = vfmadd231ps_avx512vl(auVar101,auVar91,local_380);
        auVar101 = vfmadd231ps_avx512vl(auVar92,local_480,auVar91);
        auVar176 = ZEXT3264(local_340);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar90,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_360);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1f9c);
        auVar101 = vfmadd231ps_avx512vl(auVar101,local_3e0,auVar90);
        auVar90 = vmulps_avx512vl(local_3a0,auVar92);
        auVar87 = vmulps_avx512vl(local_3c0,auVar92);
        auVar92 = vmulps_avx512vl(local_140,auVar92);
        auVar88 = vfmadd231ps_avx512vl(auVar90,auVar91,local_420);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_440);
        auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar90,local_400);
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_380);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_480,auVar90);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar93,local_340);
        auVar92 = vfmadd231ps_avx512vl(auVar87,auVar93,local_360);
        auVar90 = vfmadd231ps_avx512vl(auVar90,local_3e0,auVar93);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar89,auVar87);
        vandps_avx512vl(auVar95,auVar87);
        auVar93 = vmaxps_avx(auVar87,auVar87);
        vandps_avx512vl(auVar101,auVar87);
        auVar93 = vmaxps_avx(auVar93,auVar87);
        auVar101 = vbroadcastss_avx512vl(auVar83);
        uVar71 = vcmpps_avx512vl(auVar93,auVar101,1);
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar102._0_4_ = (float)((uint)bVar77 * auVar97._0_4_ | (uint)!bVar77 * auVar89._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar77 * auVar97._4_4_ | (uint)!bVar77 * auVar89._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar77 * auVar97._8_4_ | (uint)!bVar77 * auVar89._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar77 * auVar97._12_4_ | (uint)!bVar77 * auVar89._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar77 * auVar97._16_4_ | (uint)!bVar77 * auVar89._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar77 * auVar97._20_4_ | (uint)!bVar77 * auVar89._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar77 * auVar97._24_4_ | (uint)!bVar77 * auVar89._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar102._28_4_ = (uint)bVar77 * auVar97._28_4_ | (uint)!bVar77 * auVar89._28_4_;
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar103._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar95._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar95._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar95._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar95._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar95._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar95._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar95._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar103._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar95._28_4_;
        vandps_avx512vl(auVar91,auVar87);
        vandps_avx512vl(auVar92,auVar87);
        auVar93 = vmaxps_avx(auVar103,auVar103);
        vandps_avx512vl(auVar90,auVar87);
        auVar93 = vmaxps_avx(auVar93,auVar103);
        uVar71 = vcmpps_avx512vl(auVar93,auVar101,1);
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar104._0_4_ = (float)((uint)bVar77 * auVar97._0_4_ | (uint)!bVar77 * auVar91._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar77 * auVar97._4_4_ | (uint)!bVar77 * auVar91._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar77 * auVar97._8_4_ | (uint)!bVar77 * auVar91._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar77 * auVar97._12_4_ | (uint)!bVar77 * auVar91._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar77 * auVar97._16_4_ | (uint)!bVar77 * auVar91._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar77 * auVar97._20_4_ | (uint)!bVar77 * auVar91._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar77 * auVar97._24_4_ | (uint)!bVar77 * auVar91._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar104._28_4_ = (uint)bVar77 * auVar97._28_4_ | (uint)!bVar77 * auVar91._28_4_;
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar105._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar92._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar105._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar86 = vxorps_avx512vl(auVar159,auVar159);
        auVar178 = ZEXT1664(auVar86);
        auVar93 = vfmadd213ps_avx512vl(auVar102,auVar102,ZEXT1632(auVar86));
        auVar83 = vfmadd231ps_fma(auVar93,auVar103,auVar103);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0xbf000000));
        auVar92 = vmulps_avx512vl(ZEXT1632(auVar83),auVar91);
        fVar158 = auVar93._0_4_;
        fVar132 = auVar93._4_4_;
        fVar136 = auVar93._8_4_;
        fVar137 = auVar93._12_4_;
        fVar138 = auVar93._16_4_;
        fVar161 = auVar93._20_4_;
        fVar162 = auVar93._24_4_;
        auVar33._4_4_ = fVar132 * fVar132 * fVar132 * auVar92._4_4_;
        auVar33._0_4_ = fVar158 * fVar158 * fVar158 * auVar92._0_4_;
        auVar33._8_4_ = fVar136 * fVar136 * fVar136 * auVar92._8_4_;
        auVar33._12_4_ = fVar137 * fVar137 * fVar137 * auVar92._12_4_;
        auVar33._16_4_ = fVar138 * fVar138 * fVar138 * auVar92._16_4_;
        auVar33._20_4_ = fVar161 * fVar161 * fVar161 * auVar92._20_4_;
        auVar33._24_4_ = fVar162 * fVar162 * fVar162 * auVar92._24_4_;
        auVar33._28_4_ = auVar90._28_4_;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar93 = vfmadd231ps_avx512vl(auVar33,auVar90,auVar93);
        auVar34._4_4_ = auVar103._4_4_ * auVar93._4_4_;
        auVar34._0_4_ = auVar103._0_4_ * auVar93._0_4_;
        auVar34._8_4_ = auVar103._8_4_ * auVar93._8_4_;
        auVar34._12_4_ = auVar103._12_4_ * auVar93._12_4_;
        auVar34._16_4_ = auVar103._16_4_ * auVar93._16_4_;
        auVar34._20_4_ = auVar103._20_4_ * auVar93._20_4_;
        auVar34._24_4_ = auVar103._24_4_ * auVar93._24_4_;
        auVar34._28_4_ = auVar92._28_4_;
        auVar35._4_4_ = auVar93._4_4_ * -auVar102._4_4_;
        auVar35._0_4_ = auVar93._0_4_ * -auVar102._0_4_;
        auVar35._8_4_ = auVar93._8_4_ * -auVar102._8_4_;
        auVar35._12_4_ = auVar93._12_4_ * -auVar102._12_4_;
        auVar35._16_4_ = auVar93._16_4_ * -auVar102._16_4_;
        auVar35._20_4_ = auVar93._20_4_ * -auVar102._20_4_;
        auVar35._24_4_ = auVar93._24_4_ * -auVar102._24_4_;
        auVar35._28_4_ = auVar103._28_4_;
        auVar92 = vmulps_avx512vl(auVar93,ZEXT1632(auVar86));
        auVar101 = ZEXT1632(auVar86);
        auVar95 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar101);
        auVar83 = vfmadd231ps_fma(auVar95,auVar105,auVar105);
        auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
        auVar91 = vmulps_avx512vl(ZEXT1632(auVar83),auVar91);
        fVar158 = auVar95._0_4_;
        fVar132 = auVar95._4_4_;
        fVar136 = auVar95._8_4_;
        fVar137 = auVar95._12_4_;
        fVar138 = auVar95._16_4_;
        fVar161 = auVar95._20_4_;
        fVar162 = auVar95._24_4_;
        auVar36._4_4_ = fVar132 * fVar132 * fVar132 * auVar91._4_4_;
        auVar36._0_4_ = fVar158 * fVar158 * fVar158 * auVar91._0_4_;
        auVar36._8_4_ = fVar136 * fVar136 * fVar136 * auVar91._8_4_;
        auVar36._12_4_ = fVar137 * fVar137 * fVar137 * auVar91._12_4_;
        auVar36._16_4_ = fVar138 * fVar138 * fVar138 * auVar91._16_4_;
        auVar36._20_4_ = fVar161 * fVar161 * fVar161 * auVar91._20_4_;
        auVar36._24_4_ = fVar162 * fVar162 * fVar162 * auVar91._24_4_;
        auVar36._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd231ps_avx512vl(auVar36,auVar90,auVar95);
        auVar37._4_4_ = auVar105._4_4_ * auVar93._4_4_;
        auVar37._0_4_ = auVar105._0_4_ * auVar93._0_4_;
        auVar37._8_4_ = auVar105._8_4_ * auVar93._8_4_;
        auVar37._12_4_ = auVar105._12_4_ * auVar93._12_4_;
        auVar37._16_4_ = auVar105._16_4_ * auVar93._16_4_;
        auVar37._20_4_ = auVar105._20_4_ * auVar93._20_4_;
        auVar37._24_4_ = auVar105._24_4_ * auVar93._24_4_;
        auVar37._28_4_ = auVar91._28_4_;
        auVar38._4_4_ = auVar93._4_4_ * -auVar104._4_4_;
        auVar38._0_4_ = auVar93._0_4_ * -auVar104._0_4_;
        auVar38._8_4_ = auVar93._8_4_ * -auVar104._8_4_;
        auVar38._12_4_ = auVar93._12_4_ * -auVar104._12_4_;
        auVar38._16_4_ = auVar93._16_4_ * -auVar104._16_4_;
        auVar38._20_4_ = auVar93._20_4_ * -auVar104._20_4_;
        auVar38._24_4_ = auVar93._24_4_ * -auVar104._24_4_;
        auVar38._28_4_ = auVar95._28_4_;
        auVar93 = vmulps_avx512vl(auVar93,auVar101);
        auVar83 = vfmadd213ps_fma(auVar34,auVar99,ZEXT1632(auVar11));
        auVar81 = vfmadd213ps_fma(auVar35,auVar99,ZEXT1632(auVar12));
        auVar91 = vfmadd213ps_avx512vl(auVar92,auVar99,auVar96);
        auVar95 = vfmadd213ps_avx512vl(auVar37,auVar100,ZEXT1632(auVar13));
        auVar84 = vfnmadd213ps_fma(auVar34,auVar99,ZEXT1632(auVar11));
        auVar177 = vfmadd213ps_fma(auVar38,auVar100,ZEXT1632(auVar139));
        auVar12 = vfnmadd213ps_fma(auVar35,auVar99,ZEXT1632(auVar12));
        auVar8 = vfmadd213ps_fma(auVar93,auVar100,auVar94);
        auVar85 = vfnmadd231ps_fma(auVar96,auVar99,auVar92);
        auVar13 = vfnmadd213ps_fma(auVar37,auVar100,ZEXT1632(auVar13));
        auVar139 = vfnmadd213ps_fma(auVar38,auVar100,ZEXT1632(auVar139));
        auVar159 = vfnmadd231ps_fma(auVar94,auVar100,auVar93);
        auVar94 = vsubps_avx512vl(auVar95,ZEXT1632(auVar84));
        auVar93 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar12));
        auVar90 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar85));
        auVar39._4_4_ = auVar93._4_4_ * auVar85._4_4_;
        auVar39._0_4_ = auVar93._0_4_ * auVar85._0_4_;
        auVar39._8_4_ = auVar93._8_4_ * auVar85._8_4_;
        auVar39._12_4_ = auVar93._12_4_ * auVar85._12_4_;
        auVar39._16_4_ = auVar93._16_4_ * 0.0;
        auVar39._20_4_ = auVar93._20_4_ * 0.0;
        auVar39._24_4_ = auVar93._24_4_ * 0.0;
        auVar39._28_4_ = auVar92._28_4_;
        auVar9 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar12),auVar90);
        auVar40._4_4_ = auVar90._4_4_ * auVar84._4_4_;
        auVar40._0_4_ = auVar90._0_4_ * auVar84._0_4_;
        auVar40._8_4_ = auVar90._8_4_ * auVar84._8_4_;
        auVar40._12_4_ = auVar90._12_4_ * auVar84._12_4_;
        auVar40._16_4_ = auVar90._16_4_ * 0.0;
        auVar40._20_4_ = auVar90._20_4_ * 0.0;
        auVar40._24_4_ = auVar90._24_4_ * 0.0;
        auVar40._28_4_ = auVar90._28_4_;
        auVar10 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar85),auVar94);
        auVar41._4_4_ = auVar12._4_4_ * auVar94._4_4_;
        auVar41._0_4_ = auVar12._0_4_ * auVar94._0_4_;
        auVar41._8_4_ = auVar12._8_4_ * auVar94._8_4_;
        auVar41._12_4_ = auVar12._12_4_ * auVar94._12_4_;
        auVar41._16_4_ = auVar94._16_4_ * 0.0;
        auVar41._20_4_ = auVar94._20_4_ * 0.0;
        auVar41._24_4_ = auVar94._24_4_ * 0.0;
        auVar41._28_4_ = auVar94._28_4_;
        auVar11 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar84),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar101,ZEXT1632(auVar10));
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,ZEXT1632(auVar9));
        auVar88 = ZEXT1632(auVar86);
        uVar71 = vcmpps_avx512vl(auVar93,auVar88,2);
        bVar69 = (byte)uVar71;
        fVar79 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar13._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar126 = (float)((uint)bVar77 * auVar83._4_4_ | (uint)!bVar77 * auVar13._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar128 = (float)((uint)bVar77 * auVar83._8_4_ | (uint)!bVar77 * auVar13._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar130 = (float)((uint)bVar77 * auVar83._12_4_ | (uint)!bVar77 * auVar13._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar79))));
        fVar80 = (float)((uint)(bVar69 & 1) * auVar81._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar139._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar127 = (float)((uint)bVar77 * auVar81._4_4_ | (uint)!bVar77 * auVar139._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar129 = (float)((uint)bVar77 * auVar81._8_4_ | (uint)!bVar77 * auVar139._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar131 = (float)((uint)bVar77 * auVar81._12_4_ | (uint)!bVar77 * auVar139._12_4_);
        auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar80))));
        auVar106._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar159._0_4_
                    );
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar159._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar159._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar159._12_4_);
        fVar132 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
        auVar106._16_4_ = fVar132;
        fVar158 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
        auVar106._20_4_ = fVar158;
        fVar136 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
        auVar106._24_4_ = fVar136;
        iVar1 = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
        auVar106._28_4_ = iVar1;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar84),auVar95);
        auVar107._0_4_ =
             (uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar83._0_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar77 * auVar93._4_4_ | (uint)!bVar77 * auVar83._4_4_;
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar77 * auVar93._8_4_ | (uint)!bVar77 * auVar83._8_4_;
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar77 * auVar93._12_4_ | (uint)!bVar77 * auVar83._12_4_;
        auVar107._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_;
        auVar107._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_;
        auVar107._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_;
        auVar107._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar177));
        auVar108._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar9._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar77 * auVar93._4_4_ | (uint)!bVar77 * auVar9._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar77 * auVar93._8_4_ | (uint)!bVar77 * auVar9._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar77 * auVar93._12_4_ | (uint)!bVar77 * auVar9._12_4_);
        fVar137 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_);
        auVar108._16_4_ = fVar137;
        fVar138 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_);
        auVar108._20_4_ = fVar138;
        fVar161 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_);
        auVar108._24_4_ = fVar161;
        auVar108._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
        auVar93 = vblendmps_avx512vl(ZEXT1632(auVar85),ZEXT1632(auVar8));
        auVar109._0_4_ =
             (float)((uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar81._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar77 * auVar93._4_4_ | (uint)!bVar77 * auVar81._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar77 * auVar93._8_4_ | (uint)!bVar77 * auVar81._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar77 * auVar93._12_4_ | (uint)!bVar77 * auVar81._12_4_);
        fVar147 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_);
        auVar109._16_4_ = fVar147;
        fVar163 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_);
        auVar109._20_4_ = fVar163;
        fVar162 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_);
        auVar109._24_4_ = fVar162;
        iVar2 = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
        auVar109._28_4_ = iVar2;
        auVar110._0_4_ =
             (uint)(bVar69 & 1) * (int)auVar84._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar95._0_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar77 * (int)auVar84._4_4_ | (uint)!bVar77 * auVar95._4_4_;
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar77 * (int)auVar84._8_4_ | (uint)!bVar77 * auVar95._8_4_;
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar77 * (int)auVar84._12_4_ | (uint)!bVar77 * auVar95._12_4_;
        auVar110._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar95._16_4_;
        auVar110._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar95._20_4_;
        auVar110._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar95._24_4_;
        auVar110._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar95._28_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar97 = vsubps_avx512vl(auVar110,auVar96);
        auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar12._12_4_ |
                                                (uint)!bVar21 * auVar177._12_4_,
                                                CONCAT48((uint)bVar19 * (int)auVar12._8_4_ |
                                                         (uint)!bVar19 * auVar177._8_4_,
                                                         CONCAT44((uint)bVar77 * (int)auVar12._4_4_
                                                                  | (uint)!bVar77 * auVar177._4_4_,
                                                                  (uint)(bVar69 & 1) *
                                                                  (int)auVar12._0_4_ |
                                                                  (uint)!(bool)(bVar69 & 1) *
                                                                  auVar177._0_4_)))),auVar101);
        auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar85._12_4_ |
                                                (uint)!bVar22 * auVar8._12_4_,
                                                CONCAT48((uint)bVar20 * (int)auVar85._8_4_ |
                                                         (uint)!bVar20 * auVar8._8_4_,
                                                         CONCAT44((uint)bVar18 * (int)auVar85._4_4_
                                                                  | (uint)!bVar18 * auVar8._4_4_,
                                                                  (uint)(bVar69 & 1) *
                                                                  (int)auVar85._0_4_ |
                                                                  (uint)!(bool)(bVar69 & 1) *
                                                                  auVar8._0_4_)))),auVar106);
        auVar92 = vsubps_avx(auVar96,auVar107);
        auVar95 = vsubps_avx(auVar101,auVar108);
        auVar94 = vsubps_avx(auVar106,auVar109);
        auVar42._4_4_ = auVar91._4_4_ * fVar126;
        auVar42._0_4_ = auVar91._0_4_ * fVar79;
        auVar42._8_4_ = auVar91._8_4_ * fVar128;
        auVar42._12_4_ = auVar91._12_4_ * fVar130;
        auVar42._16_4_ = auVar91._16_4_ * 0.0;
        auVar42._20_4_ = auVar91._20_4_ * 0.0;
        auVar42._24_4_ = auVar91._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar42,auVar106,auVar97);
        auVar150._0_4_ = fVar80 * auVar97._0_4_;
        auVar150._4_4_ = fVar127 * auVar97._4_4_;
        auVar150._8_4_ = fVar129 * auVar97._8_4_;
        auVar150._12_4_ = fVar131 * auVar97._12_4_;
        auVar150._16_4_ = auVar97._16_4_ * 0.0;
        auVar150._20_4_ = auVar97._20_4_ * 0.0;
        auVar150._24_4_ = auVar97._24_4_ * 0.0;
        auVar150._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar150,auVar96,auVar90);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar88,ZEXT1632(auVar83));
        auVar152._0_4_ = auVar90._0_4_ * auVar106._0_4_;
        auVar152._4_4_ = auVar90._4_4_ * auVar106._4_4_;
        auVar152._8_4_ = auVar90._8_4_ * auVar106._8_4_;
        auVar152._12_4_ = auVar90._12_4_ * auVar106._12_4_;
        auVar152._16_4_ = auVar90._16_4_ * fVar132;
        auVar152._20_4_ = auVar90._20_4_ * fVar158;
        auVar152._24_4_ = auVar90._24_4_ * fVar136;
        auVar152._28_4_ = 0;
        auVar83 = vfmsub231ps_fma(auVar152,auVar101,auVar91);
        auVar98 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar83));
        auVar93 = vmulps_avx512vl(auVar94,auVar107);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar109);
        auVar43._4_4_ = auVar95._4_4_ * auVar109._4_4_;
        auVar43._0_4_ = auVar95._0_4_ * auVar109._0_4_;
        auVar43._8_4_ = auVar95._8_4_ * auVar109._8_4_;
        auVar43._12_4_ = auVar95._12_4_ * auVar109._12_4_;
        auVar43._16_4_ = auVar95._16_4_ * fVar147;
        auVar43._20_4_ = auVar95._20_4_ * fVar163;
        auVar43._24_4_ = auVar95._24_4_ * fVar162;
        auVar43._28_4_ = iVar2;
        auVar83 = vfmsub231ps_fma(auVar43,auVar108,auVar94);
        auVar153._0_4_ = auVar108._0_4_ * auVar92._0_4_;
        auVar153._4_4_ = auVar108._4_4_ * auVar92._4_4_;
        auVar153._8_4_ = auVar108._8_4_ * auVar92._8_4_;
        auVar153._12_4_ = auVar108._12_4_ * auVar92._12_4_;
        auVar153._16_4_ = fVar137 * auVar92._16_4_;
        auVar153._20_4_ = fVar138 * auVar92._20_4_;
        auVar153._24_4_ = fVar161 * auVar92._24_4_;
        auVar153._28_4_ = 0;
        auVar81 = vfmsub231ps_fma(auVar153,auVar95,auVar107);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar88,auVar93);
        auVar89 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar83));
        auVar93 = vmaxps_avx(auVar98,auVar89);
        uVar24 = vcmpps_avx512vl(auVar93,auVar88,2);
        bVar78 = bVar78 & (byte)uVar24;
        auVar187 = ZEXT3264(local_360);
        auVar185 = ZEXT3264(local_400);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar179 = ZEXT3264(auVar87);
        auVar184 = ZEXT3264(local_380);
        auVar182 = ZEXT3264(local_420);
        auVar188 = ZEXT3264(local_440);
        auVar183 = ZEXT3264(local_3a0);
        if (bVar78 == 0) {
          bVar77 = false;
LAB_01cedb5c:
          auVar180 = ZEXT3264(local_3e0);
          auVar181 = ZEXT3264(local_480);
        }
        else {
          auVar44._4_4_ = auVar94._4_4_ * auVar90._4_4_;
          auVar44._0_4_ = auVar94._0_4_ * auVar90._0_4_;
          auVar44._8_4_ = auVar94._8_4_ * auVar90._8_4_;
          auVar44._12_4_ = auVar94._12_4_ * auVar90._12_4_;
          auVar44._16_4_ = auVar94._16_4_ * auVar90._16_4_;
          auVar44._20_4_ = auVar94._20_4_ * auVar90._20_4_;
          auVar44._24_4_ = auVar94._24_4_ * auVar90._24_4_;
          auVar44._28_4_ = auVar93._28_4_;
          auVar177 = vfmsub231ps_fma(auVar44,auVar95,auVar91);
          auVar45._4_4_ = auVar91._4_4_ * auVar92._4_4_;
          auVar45._0_4_ = auVar91._0_4_ * auVar92._0_4_;
          auVar45._8_4_ = auVar91._8_4_ * auVar92._8_4_;
          auVar45._12_4_ = auVar91._12_4_ * auVar92._12_4_;
          auVar45._16_4_ = auVar91._16_4_ * auVar92._16_4_;
          auVar45._20_4_ = auVar91._20_4_ * auVar92._20_4_;
          auVar45._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          auVar45._28_4_ = auVar91._28_4_;
          auVar81 = vfmsub231ps_fma(auVar45,auVar97,auVar94);
          auVar46._4_4_ = auVar95._4_4_ * auVar97._4_4_;
          auVar46._0_4_ = auVar95._0_4_ * auVar97._0_4_;
          auVar46._8_4_ = auVar95._8_4_ * auVar97._8_4_;
          auVar46._12_4_ = auVar95._12_4_ * auVar97._12_4_;
          auVar46._16_4_ = auVar95._16_4_ * auVar97._16_4_;
          auVar46._20_4_ = auVar95._20_4_ * auVar97._20_4_;
          auVar46._24_4_ = auVar95._24_4_ * auVar97._24_4_;
          auVar46._28_4_ = auVar95._28_4_;
          auVar8 = vfmsub231ps_fma(auVar46,auVar92,auVar90);
          auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar8));
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar177),auVar88);
          auVar93 = vrcp14ps_avx512vl(auVar90);
          auVar91 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar87);
          auVar83 = vfmadd132ps_fma(auVar91,auVar93,auVar93);
          auVar47._4_4_ = auVar8._4_4_ * auVar106._4_4_;
          auVar47._0_4_ = auVar8._0_4_ * auVar106._0_4_;
          auVar47._8_4_ = auVar8._8_4_ * auVar106._8_4_;
          auVar47._12_4_ = auVar8._12_4_ * auVar106._12_4_;
          auVar47._16_4_ = fVar132 * 0.0;
          auVar47._20_4_ = fVar158 * 0.0;
          auVar47._24_4_ = fVar136 * 0.0;
          auVar47._28_4_ = iVar1;
          auVar81 = vfmadd231ps_fma(auVar47,auVar101,ZEXT1632(auVar81));
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar96,ZEXT1632(auVar177));
          fVar132 = auVar83._0_4_;
          fVar136 = auVar83._4_4_;
          fVar137 = auVar83._8_4_;
          fVar138 = auVar83._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar138,
                                         CONCAT48(auVar81._8_4_ * fVar137,
                                                  CONCAT44(auVar81._4_4_ * fVar136,
                                                           auVar81._0_4_ * fVar132))));
          auVar165._8_4_ = 3;
          auVar165._0_8_ = 0x300000003;
          auVar165._12_4_ = 3;
          auVar165._16_4_ = 3;
          auVar165._20_4_ = 3;
          auVar165._24_4_ = 3;
          auVar165._28_4_ = 3;
          auVar93 = vpermps_avx2(auVar165,ZEXT1632((undefined1  [16])aVar3));
          uVar24 = vcmpps_avx512vl(auVar93,local_220,2);
          fVar158 = local_558->tfar;
          auVar26._4_4_ = fVar158;
          auVar26._0_4_ = fVar158;
          auVar26._8_4_ = fVar158;
          auVar26._12_4_ = fVar158;
          auVar26._16_4_ = fVar158;
          auVar26._20_4_ = fVar158;
          auVar26._24_4_ = fVar158;
          auVar26._28_4_ = fVar158;
          uVar25 = vcmpps_avx512vl(local_220,auVar26,2);
          bVar78 = (byte)uVar24 & (byte)uVar25 & bVar78;
          auVar180 = ZEXT3264(local_3e0);
          auVar181 = ZEXT3264(local_480);
          if (bVar78 != 0) {
            uVar24 = vcmpps_avx512vl(auVar90,auVar88,4);
            bVar78 = bVar78 & (byte)uVar24;
            if (bVar78 != 0) {
              fVar158 = auVar98._0_4_ * fVar132;
              fVar161 = auVar98._4_4_ * fVar136;
              auVar48._4_4_ = fVar161;
              auVar48._0_4_ = fVar158;
              fVar162 = auVar98._8_4_ * fVar137;
              auVar48._8_4_ = fVar162;
              fVar163 = auVar98._12_4_ * fVar138;
              auVar48._12_4_ = fVar163;
              fVar147 = auVar98._16_4_ * 0.0;
              auVar48._16_4_ = fVar147;
              fVar79 = auVar98._20_4_ * 0.0;
              auVar48._20_4_ = fVar79;
              fVar80 = auVar98._24_4_ * 0.0;
              auVar48._24_4_ = fVar80;
              auVar48._28_4_ = auVar90._28_4_;
              auVar93 = vsubps_avx512vl(auVar87,auVar48);
              local_260._0_4_ =
                   (float)((uint)(bVar69 & 1) * (int)fVar158 |
                          (uint)!(bool)(bVar69 & 1) * auVar93._0_4_);
              bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
              local_260._4_4_ = (float)((uint)bVar77 * (int)fVar161 | (uint)!bVar77 * auVar93._4_4_)
              ;
              bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar77 * (int)fVar162 | (uint)!bVar77 * auVar93._8_4_)
              ;
              bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar77 * (int)fVar163 | (uint)!bVar77 * auVar93._12_4_);
              bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar77 * (int)fVar147 | (uint)!bVar77 * auVar93._16_4_);
              bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar77 * (int)fVar79 | (uint)!bVar77 * auVar93._20_4_);
              bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar77 * (int)fVar80 | (uint)!bVar77 * auVar93._24_4_);
              bVar77 = SUB81(uVar71 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar77 * auVar90._28_4_ | (uint)!bVar77 * auVar93._28_4_);
              auVar93 = vsubps_avx(auVar100,auVar99);
              auVar83 = vfmadd213ps_fma(auVar93,local_260,auVar99);
              fVar158 = local_538->depth_scale;
              auVar27._4_4_ = fVar158;
              auVar27._0_4_ = fVar158;
              auVar27._8_4_ = fVar158;
              auVar27._12_4_ = fVar158;
              auVar27._16_4_ = fVar158;
              auVar27._20_4_ = fVar158;
              auVar27._24_4_ = fVar158;
              auVar27._28_4_ = fVar158;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                           CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                    CONCAT44(auVar83._4_4_ +
                                                                             auVar83._4_4_,
                                                                             auVar83._0_4_ +
                                                                             auVar83._0_4_)))),
                                        auVar27);
              uVar24 = vcmpps_avx512vl(local_220,auVar93,6);
              if (((byte)uVar24 & bVar78) != 0) {
                auVar6._0_4_ = local_558->tfar;
                auVar6._4_4_ = local_558->mask;
                auVar6._8_4_ = local_558->id;
                auVar6._12_4_ = local_558->flags;
                uVar70 = vextractps_avx(auVar6,1);
                auVar146._0_4_ = auVar89._0_4_ * fVar132;
                auVar146._4_4_ = auVar89._4_4_ * fVar136;
                auVar146._8_4_ = auVar89._8_4_ * fVar137;
                auVar146._12_4_ = auVar89._12_4_ * fVar138;
                auVar146._16_4_ = auVar89._16_4_ * 0.0;
                auVar146._20_4_ = auVar89._20_4_ * 0.0;
                auVar146._24_4_ = auVar89._24_4_ * 0.0;
                auVar146._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar87,auVar146);
                auVar111._0_4_ =
                     (uint)(bVar69 & 1) * (int)auVar146._0_4_ |
                     (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
                bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
                auVar111._4_4_ = (uint)bVar77 * (int)auVar146._4_4_ | (uint)!bVar77 * auVar93._4_4_;
                bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
                auVar111._8_4_ = (uint)bVar77 * (int)auVar146._8_4_ | (uint)!bVar77 * auVar93._8_4_;
                bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
                auVar111._12_4_ =
                     (uint)bVar77 * (int)auVar146._12_4_ | (uint)!bVar77 * auVar93._12_4_;
                bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
                auVar111._16_4_ =
                     (uint)bVar77 * (int)auVar146._16_4_ | (uint)!bVar77 * auVar93._16_4_;
                bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
                auVar111._20_4_ =
                     (uint)bVar77 * (int)auVar146._20_4_ | (uint)!bVar77 * auVar93._20_4_;
                bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
                auVar111._24_4_ =
                     (uint)bVar77 * (int)auVar146._24_4_ | (uint)!bVar77 * auVar93._24_4_;
                auVar111._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar93._28_4_;
                auVar28._8_4_ = 0x40000000;
                auVar28._0_8_ = 0x4000000040000000;
                auVar28._12_4_ = 0x40000000;
                auVar28._16_4_ = 0x40000000;
                auVar28._20_4_ = 0x40000000;
                auVar28._24_4_ = 0x40000000;
                auVar28._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar111,auVar87,auVar28);
                local_200 = 0;
                local_1fc = iVar15;
                local_1f0 = local_4a0._0_8_;
                uStack_1e8 = local_4a0._8_8_;
                local_1e0 = local_490._0_8_;
                uStack_1d8 = local_490._8_8_;
                local_1d0 = local_4b0._0_8_;
                uStack_1c8 = local_4b0._8_8_;
                if ((pGVar16->mask & uVar70) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar77 = true, local_4b0 = auVar82, local_4a0 = auVar142, local_490 = auVar140
                     , pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar158 = 1.0 / (float)local_300._0_4_;
                    local_1a0[0] = fVar158 * (local_260._0_4_ + 0.0);
                    local_1a0[1] = fVar158 * (local_260._4_4_ + 1.0);
                    local_1a0[2] = fVar158 * (local_260._8_4_ + 2.0);
                    local_1a0[3] = fVar158 * (local_260._12_4_ + 3.0);
                    fStack_190 = fVar158 * (local_260._16_4_ + 4.0);
                    fStack_18c = fVar158 * (local_260._20_4_ + 5.0);
                    fStack_188 = fVar158 * (local_260._24_4_ + 6.0);
                    fStack_184 = local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    lVar75 = 0;
                    local_548 = (ulong)((byte)uVar24 & bVar78);
                    for (uVar71 = local_548; (uVar71 & 1) == 0;
                        uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                      lVar75 = lVar75 + 1;
                    }
                    local_450 = auVar6;
                    local_4b0 = auVar82;
                    local_4a0 = auVar142;
                    local_490 = auVar140;
                    do {
                      auVar177 = auVar178._0_16_;
                      local_4f4 = local_1a0[lVar75];
                      local_4f0 = *(undefined4 *)(local_180 + lVar75 * 4);
                      local_2c0._0_8_ = lVar75;
                      local_558->tfar = *(float *)(local_160 + lVar75 * 4);
                      local_530.context = context->user;
                      fVar132 = 1.0 - local_4f4;
                      fVar158 = fVar132 * fVar132 * -3.0;
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                ZEXT416((uint)(local_4f4 * fVar132)),
                                                ZEXT416(0xc0000000));
                      auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4f4 * fVar132)),
                                                ZEXT416((uint)(local_4f4 * local_4f4)),
                                                ZEXT416(0x40000000));
                      fVar132 = auVar83._0_4_ * 3.0;
                      fVar136 = auVar81._0_4_ * 3.0;
                      fVar137 = local_4f4 * local_4f4 * 3.0;
                      auVar156._0_4_ = fVar137 * (float)local_310._0_4_;
                      auVar156._4_4_ = fVar137 * (float)local_310._4_4_;
                      auVar156._8_4_ = fVar137 * fStack_308;
                      auVar156._12_4_ = fVar137 * fStack_304;
                      auVar142._4_4_ = fVar136;
                      auVar142._0_4_ = fVar136;
                      auVar142._8_4_ = fVar136;
                      auVar142._12_4_ = fVar136;
                      auVar83 = vfmadd132ps_fma(auVar142,auVar156,local_4b0);
                      auVar148._4_4_ = fVar132;
                      auVar148._0_4_ = fVar132;
                      auVar148._8_4_ = fVar132;
                      auVar148._12_4_ = fVar132;
                      auVar83 = vfmadd132ps_fma(auVar148,auVar83,local_490);
                      auVar143._4_4_ = fVar158;
                      auVar143._0_4_ = fVar158;
                      auVar143._8_4_ = fVar158;
                      auVar143._12_4_ = fVar158;
                      auVar83 = vfmadd132ps_fma(auVar143,auVar83,local_4a0);
                      local_500 = vmovlps_avx(auVar83);
                      local_4f8 = vextractps_avx(auVar83,2);
                      local_4ec = (int)local_4b8;
                      local_4e8 = (int)local_540;
                      local_4e4 = (local_530.context)->instID[0];
                      local_4e0 = (local_530.context)->instPrimID[0];
                      local_55c = -1;
                      local_530.valid = &local_55c;
                      local_530.geometryUserPtr = pGVar16->userPtr;
                      local_530.ray = (RTCRayN *)local_558;
                      local_530.hit = (RTCHitN *)&local_500;
                      local_530.N = 1;
                      if ((pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar16->occlusionFilterN)(&local_530), *local_530.valid != 0)) {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar16->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var17)(&local_530), *local_530.valid != 0)))) {
                          bVar77 = true;
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar179 = ZEXT3264(auVar93);
                          auVar83 = vxorps_avx512vl(auVar177,auVar177);
                          auVar178 = ZEXT1664(auVar83);
                          auVar176 = ZEXT3264(local_340);
                          auVar187 = ZEXT3264(local_360);
                          auVar185 = ZEXT3264(local_400);
                          auVar184 = ZEXT3264(local_380);
                          auVar182 = ZEXT3264(local_420);
                          auVar188 = ZEXT3264(local_440);
                          auVar183 = ZEXT3264(local_3a0);
                          auVar186 = ZEXT3264(local_3c0);
                          goto LAB_01cedb5c;
                        }
                      }
                      local_558->tfar = (float)local_450._0_4_;
                      bVar77 = false;
                      lVar75 = 0;
                      local_548 = local_548 ^ 1L << (local_2c0._0_8_ & 0x3f);
                      for (uVar71 = local_548; (uVar71 & 1) == 0;
                          uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        lVar75 = lVar75 + 1;
                      }
                      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar179 = ZEXT3264(auVar93);
                      auVar83 = vxorps_avx512vl(auVar177,auVar177);
                      auVar178 = ZEXT1664(auVar83);
                      auVar176 = ZEXT3264(local_340);
                      auVar187 = ZEXT3264(local_360);
                      auVar185 = ZEXT3264(local_400);
                      auVar184 = ZEXT3264(local_380);
                      auVar182 = ZEXT3264(local_420);
                      auVar188 = ZEXT3264(local_440);
                      auVar183 = ZEXT3264(local_3a0);
                      auVar186 = ZEXT3264(local_3c0);
                      auVar180 = ZEXT3264(local_3e0);
                      auVar181 = ZEXT3264(local_480);
                    } while (local_548 != 0);
                  }
                  goto LAB_01ced04c;
                }
              }
            }
          }
          bVar77 = false;
          local_4b0 = auVar82;
          local_4a0 = auVar142;
          local_490 = auVar140;
        }
      }
LAB_01ced04c:
      if (8 < iVar15) {
        local_2c0 = vpbroadcastd_avx512vl();
        uStack_29c = local_2a0;
        uStack_298 = local_2a0;
        uStack_294 = local_2a0;
        uStack_290 = local_2a0;
        uStack_28c = local_2a0;
        uStack_288 = local_2a0;
        uStack_284 = local_2a0;
        auVar135._8_4_ = 3;
        auVar135._0_8_ = 0x300000003;
        auVar135._12_4_ = 3;
        auVar135._16_4_ = 3;
        auVar135._20_4_ = 3;
        auVar135._24_4_ = 3;
        auVar135._28_4_ = 3;
        local_2e0 = vpermps_avx2(auVar135,local_2e0);
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar75 = 8;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar95 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar25 = vpcmpd_avx512vl(auVar95,local_2c0,1);
          auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar67);
          auVar90 = *(undefined1 (*) [32])(lVar67 + 0x21aa768 + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar67 + 0x21aabec + lVar75 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar67 + 0x21ab070 + lVar75 * 4);
          local_3a0 = auVar183._0_32_;
          auVar94 = vmulps_avx512vl(local_3a0,auVar92);
          local_3c0 = auVar186._0_32_;
          auVar96 = vmulps_avx512vl(local_3c0,auVar92);
          auVar49._4_4_ = auVar92._4_4_ * (float)local_e0._4_4_;
          auVar49._0_4_ = auVar92._0_4_ * (float)local_e0._0_4_;
          auVar49._8_4_ = auVar92._8_4_ * fStack_d8;
          auVar49._12_4_ = auVar92._12_4_ * fStack_d4;
          auVar49._16_4_ = auVar92._16_4_ * fStack_d0;
          auVar49._20_4_ = auVar92._20_4_ * fStack_cc;
          auVar49._24_4_ = auVar92._24_4_ * fStack_c8;
          auVar49._28_4_ = auVar95._28_4_;
          auVar160 = auVar182._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar160);
          auVar171 = auVar188._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar171);
          auVar83 = vfmadd231ps_fma(auVar49,auVar91,local_c0);
          auVar164 = auVar185._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar164);
          local_380 = auVar184._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_380);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar90,local_a0);
          local_340 = auVar176._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar95,auVar93,local_340);
          local_360 = auVar187._0_32_;
          auVar99 = vfmadd231ps_avx512vl(auVar94,auVar93,local_360);
          auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar67);
          auVar94 = *(undefined1 (*) [32])(lVar67 + 0x21acb88 + lVar75 * 4);
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar93,local_100);
          auVar96 = *(undefined1 (*) [32])(lVar67 + 0x21ad00c + lVar75 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar67 + 0x21ad490 + lVar75 * 4);
          auVar97 = vmulps_avx512vl(local_3a0,auVar101);
          auVar98 = vmulps_avx512vl(local_3c0,auVar101);
          auVar50._4_4_ = auVar101._4_4_ * (float)local_e0._4_4_;
          auVar50._0_4_ = auVar101._0_4_ * (float)local_e0._0_4_;
          auVar50._8_4_ = auVar101._8_4_ * fStack_d8;
          auVar50._12_4_ = auVar101._12_4_ * fStack_d4;
          auVar50._16_4_ = auVar101._16_4_ * fStack_d0;
          auVar50._20_4_ = auVar101._20_4_ * fStack_cc;
          auVar50._24_4_ = auVar101._24_4_ * fStack_c8;
          auVar50._28_4_ = uStack_c4;
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,auVar160);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar171);
          auVar83 = vfmadd231ps_fma(auVar50,auVar96,local_c0);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar164);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_380);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar94,local_a0);
          auVar87 = vfmadd231ps_avx512vl(auVar97,auVar95,local_340);
          auVar88 = vfmadd231ps_avx512vl(auVar98,auVar95,local_360);
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),auVar95,local_100);
          auVar113 = vmaxps_avx512vl(auVar100,auVar112);
          auVar97 = vsubps_avx(auVar87,auVar89);
          auVar98 = vsubps_avx(auVar88,auVar99);
          auVar114 = vmulps_avx512vl(auVar99,auVar97);
          auVar115 = vmulps_avx512vl(auVar89,auVar98);
          auVar114 = vsubps_avx512vl(auVar114,auVar115);
          auVar115 = vmulps_avx512vl(auVar98,auVar98);
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar97,auVar97);
          auVar113 = vmulps_avx512vl(auVar113,auVar113);
          auVar113 = vmulps_avx512vl(auVar113,auVar115);
          auVar114 = vmulps_avx512vl(auVar114,auVar114);
          uVar24 = vcmpps_avx512vl(auVar114,auVar113,2);
          bVar78 = (byte)uVar25 & (byte)uVar24;
          if (bVar78 == 0) {
            auVar176 = ZEXT3264(local_340);
          }
          else {
            auVar101 = vmulps_avx512vl(local_140,auVar101);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar101);
            local_480 = auVar181._0_32_;
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_480,auVar96);
            local_3e0 = auVar180._0_32_;
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_3e0,auVar94);
            auVar92 = vmulps_avx512vl(local_140,auVar92);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar92);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_480,auVar91);
            auVar94 = vfmadd213ps_avx512vl(auVar93,local_3e0,auVar90);
            auVar93 = *(undefined1 (*) [32])(lVar67 + 0x21ab4f4 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar67 + 0x21ab978 + lVar75 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar67 + 0x21abdfc + lVar75 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar67 + 0x21ac280 + lVar75 * 4);
            auVar96 = vmulps_avx512vl(local_3a0,auVar92);
            auVar101 = vmulps_avx512vl(local_3c0,auVar92);
            auVar92 = vmulps_avx512vl(local_140,auVar92);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar160);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,auVar171);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
            auVar92 = vfmadd231ps_avx512vl(auVar96,auVar90,auVar164);
            auVar96 = vfmadd231ps_avx512vl(auVar101,auVar90,local_380);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_480,auVar90);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,local_340);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar93,local_360);
            auVar101 = vfmadd231ps_avx512vl(auVar90,local_3e0,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar67 + 0x21ad914 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar67 + 0x21ae21c + lVar75 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar67 + 0x21ae6a0 + lVar75 * 4);
            auVar113 = vmulps_avx512vl(local_3a0,auVar91);
            auVar114 = vmulps_avx512vl(local_3c0,auVar91);
            auVar91 = vmulps_avx512vl(local_140,auVar91);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar90,auVar160);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar90,auVar171);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_120,auVar90);
            auVar90 = *(undefined1 (*) [32])(lVar67 + 0x21add98 + lVar75 * 4);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar90,auVar164);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar90,local_380);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_480,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar113,auVar93,local_340);
            auVar113 = vfmadd231ps_avx512vl(auVar114,auVar93,local_360);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_3e0,auVar93);
            auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar114);
            vandps_avx512vl(auVar96,auVar114);
            auVar93 = vmaxps_avx(auVar114,auVar114);
            vandps_avx512vl(auVar101,auVar114);
            auVar93 = vmaxps_avx(auVar93,auVar114);
            auVar68._4_4_ = uStack_29c;
            auVar68._0_4_ = local_2a0;
            auVar68._8_4_ = uStack_298;
            auVar68._12_4_ = uStack_294;
            auVar68._16_4_ = uStack_290;
            auVar68._20_4_ = uStack_28c;
            auVar68._24_4_ = uStack_288;
            auVar68._28_4_ = uStack_284;
            uVar71 = vcmpps_avx512vl(auVar93,auVar68,1);
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar116._0_4_ = (float)((uint)bVar18 * auVar97._0_4_ | (uint)!bVar18 * auVar92._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar92._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar92._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar92._12_4_);
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar116._16_4_ =
                 (float)((uint)bVar18 * auVar97._16_4_ | (uint)!bVar18 * auVar92._16_4_);
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar116._20_4_ =
                 (float)((uint)bVar18 * auVar97._20_4_ | (uint)!bVar18 * auVar92._20_4_);
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar116._24_4_ =
                 (float)((uint)bVar18 * auVar97._24_4_ | (uint)!bVar18 * auVar92._24_4_);
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar116._28_4_ = (uint)bVar18 * auVar97._28_4_ | (uint)!bVar18 * auVar92._28_4_;
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar117._0_4_ = (float)((uint)bVar18 * auVar98._0_4_ | (uint)!bVar18 * auVar96._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar18 * auVar98._4_4_ | (uint)!bVar18 * auVar96._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar18 * auVar98._8_4_ | (uint)!bVar18 * auVar96._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar18 * auVar98._12_4_ | (uint)!bVar18 * auVar96._12_4_);
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar18 * auVar98._16_4_ | (uint)!bVar18 * auVar96._16_4_);
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar18 * auVar98._20_4_ | (uint)!bVar18 * auVar96._20_4_);
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar18 * auVar98._24_4_ | (uint)!bVar18 * auVar96._24_4_);
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar117._28_4_ = (uint)bVar18 * auVar98._28_4_ | (uint)!bVar18 * auVar96._28_4_;
            vandps_avx512vl(auVar91,auVar114);
            vandps_avx512vl(auVar113,auVar114);
            auVar93 = vmaxps_avx(auVar117,auVar117);
            vandps_avx512vl(auVar90,auVar114);
            auVar93 = vmaxps_avx(auVar93,auVar117);
            uVar71 = vcmpps_avx512vl(auVar93,auVar68,1);
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar118._0_4_ = (uint)bVar18 * auVar97._0_4_ | (uint)!bVar18 * auVar91._0_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar91._4_4_;
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar91._8_4_;
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar91._12_4_;
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar118._16_4_ = (uint)bVar18 * auVar97._16_4_ | (uint)!bVar18 * auVar91._16_4_;
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar118._20_4_ = (uint)bVar18 * auVar97._20_4_ | (uint)!bVar18 * auVar91._20_4_;
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar118._24_4_ = (uint)bVar18 * auVar97._24_4_ | (uint)!bVar18 * auVar91._24_4_;
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar118._28_4_ = (uint)bVar18 * auVar97._28_4_ | (uint)!bVar18 * auVar91._28_4_;
            bVar18 = (bool)((byte)uVar71 & 1);
            auVar119._0_4_ = (float)((uint)bVar18 * auVar98._0_4_ | (uint)!bVar18 * auVar113._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar119._4_4_ = (float)((uint)bVar18 * auVar98._4_4_ | (uint)!bVar18 * auVar113._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar119._8_4_ = (float)((uint)bVar18 * auVar98._8_4_ | (uint)!bVar18 * auVar113._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar119._12_4_ =
                 (float)((uint)bVar18 * auVar98._12_4_ | (uint)!bVar18 * auVar113._12_4_);
            bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar119._16_4_ =
                 (float)((uint)bVar18 * auVar98._16_4_ | (uint)!bVar18 * auVar113._16_4_);
            bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar119._20_4_ =
                 (float)((uint)bVar18 * auVar98._20_4_ | (uint)!bVar18 * auVar113._20_4_);
            bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar119._24_4_ =
                 (float)((uint)bVar18 * auVar98._24_4_ | (uint)!bVar18 * auVar113._24_4_);
            bVar18 = SUB81(uVar71 >> 7,0);
            auVar119._28_4_ = (uint)bVar18 * auVar98._28_4_ | (uint)!bVar18 * auVar113._28_4_;
            auVar168._8_4_ = 0x80000000;
            auVar168._0_8_ = 0x8000000080000000;
            auVar168._12_4_ = 0x80000000;
            auVar168._16_4_ = 0x80000000;
            auVar168._20_4_ = 0x80000000;
            auVar168._24_4_ = 0x80000000;
            auVar168._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar118,auVar168);
            auVar113 = auVar178._0_32_;
            auVar90 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar113);
            auVar83 = vfmadd231ps_fma(auVar90,auVar117,auVar117);
            auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
            auVar175._8_4_ = 0xbf000000;
            auVar175._0_8_ = 0xbf000000bf000000;
            auVar175._12_4_ = 0xbf000000;
            auVar175._16_4_ = 0xbf000000;
            auVar175._20_4_ = 0xbf000000;
            auVar175._24_4_ = 0xbf000000;
            auVar175._28_4_ = 0xbf000000;
            fVar158 = auVar90._0_4_;
            fVar132 = auVar90._4_4_;
            fVar136 = auVar90._8_4_;
            fVar137 = auVar90._12_4_;
            fVar138 = auVar90._16_4_;
            fVar161 = auVar90._20_4_;
            fVar162 = auVar90._24_4_;
            auVar51._4_4_ = fVar132 * fVar132 * fVar132 * auVar83._4_4_ * -0.5;
            auVar51._0_4_ = fVar158 * fVar158 * fVar158 * auVar83._0_4_ * -0.5;
            auVar51._8_4_ = fVar136 * fVar136 * fVar136 * auVar83._8_4_ * -0.5;
            auVar51._12_4_ = fVar137 * fVar137 * fVar137 * auVar83._12_4_ * -0.5;
            auVar51._16_4_ = fVar138 * fVar138 * fVar138 * -0.0;
            auVar51._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
            auVar51._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
            auVar51._28_4_ = auVar117._28_4_;
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar90 = vfmadd231ps_avx512vl(auVar51,auVar91,auVar90);
            auVar52._4_4_ = auVar117._4_4_ * auVar90._4_4_;
            auVar52._0_4_ = auVar117._0_4_ * auVar90._0_4_;
            auVar52._8_4_ = auVar117._8_4_ * auVar90._8_4_;
            auVar52._12_4_ = auVar117._12_4_ * auVar90._12_4_;
            auVar52._16_4_ = auVar117._16_4_ * auVar90._16_4_;
            auVar52._20_4_ = auVar117._20_4_ * auVar90._20_4_;
            auVar52._24_4_ = auVar117._24_4_ * auVar90._24_4_;
            auVar52._28_4_ = 0;
            auVar53._4_4_ = auVar90._4_4_ * -auVar116._4_4_;
            auVar53._0_4_ = auVar90._0_4_ * -auVar116._0_4_;
            auVar53._8_4_ = auVar90._8_4_ * -auVar116._8_4_;
            auVar53._12_4_ = auVar90._12_4_ * -auVar116._12_4_;
            auVar53._16_4_ = auVar90._16_4_ * -auVar116._16_4_;
            auVar53._20_4_ = auVar90._20_4_ * -auVar116._20_4_;
            auVar53._24_4_ = auVar90._24_4_ * -auVar116._24_4_;
            auVar53._28_4_ = auVar117._28_4_;
            auVar92 = vmulps_avx512vl(auVar90,auVar113);
            auVar90 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar113);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar119,auVar119);
            auVar96 = vrsqrt14ps_avx512vl(auVar90);
            auVar90 = vmulps_avx512vl(auVar90,auVar175);
            fVar158 = auVar96._0_4_;
            fVar132 = auVar96._4_4_;
            fVar136 = auVar96._8_4_;
            fVar137 = auVar96._12_4_;
            fVar138 = auVar96._16_4_;
            fVar161 = auVar96._20_4_;
            fVar162 = auVar96._24_4_;
            auVar54._4_4_ = fVar132 * fVar132 * fVar132 * auVar90._4_4_;
            auVar54._0_4_ = fVar158 * fVar158 * fVar158 * auVar90._0_4_;
            auVar54._8_4_ = fVar136 * fVar136 * fVar136 * auVar90._8_4_;
            auVar54._12_4_ = fVar137 * fVar137 * fVar137 * auVar90._12_4_;
            auVar54._16_4_ = fVar138 * fVar138 * fVar138 * auVar90._16_4_;
            auVar54._20_4_ = fVar161 * fVar161 * fVar161 * auVar90._20_4_;
            auVar54._24_4_ = fVar162 * fVar162 * fVar162 * auVar90._24_4_;
            auVar54._28_4_ = auVar90._28_4_;
            auVar90 = vfmadd231ps_avx512vl(auVar54,auVar91,auVar96);
            auVar55._4_4_ = auVar119._4_4_ * auVar90._4_4_;
            auVar55._0_4_ = auVar119._0_4_ * auVar90._0_4_;
            auVar55._8_4_ = auVar119._8_4_ * auVar90._8_4_;
            auVar55._12_4_ = auVar119._12_4_ * auVar90._12_4_;
            auVar55._16_4_ = auVar119._16_4_ * auVar90._16_4_;
            auVar55._20_4_ = auVar119._20_4_ * auVar90._20_4_;
            auVar55._24_4_ = auVar119._24_4_ * auVar90._24_4_;
            auVar55._28_4_ = auVar96._28_4_;
            auVar56._4_4_ = auVar90._4_4_ * auVar93._4_4_;
            auVar56._0_4_ = auVar90._0_4_ * auVar93._0_4_;
            auVar56._8_4_ = auVar90._8_4_ * auVar93._8_4_;
            auVar56._12_4_ = auVar90._12_4_ * auVar93._12_4_;
            auVar56._16_4_ = auVar90._16_4_ * auVar93._16_4_;
            auVar56._20_4_ = auVar90._20_4_ * auVar93._20_4_;
            auVar56._24_4_ = auVar90._24_4_ * auVar93._24_4_;
            auVar56._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar90,auVar113);
            auVar83 = vfmadd213ps_fma(auVar52,auVar100,auVar89);
            auVar81 = vfmadd213ps_fma(auVar53,auVar100,auVar99);
            auVar91 = vfmadd213ps_avx512vl(auVar92,auVar100,auVar94);
            auVar96 = vfmadd213ps_avx512vl(auVar55,auVar112,auVar87);
            auVar12 = vfnmadd213ps_fma(auVar52,auVar100,auVar89);
            auVar177 = vfmadd213ps_fma(auVar56,auVar112,auVar88);
            auVar13 = vfnmadd213ps_fma(auVar53,auVar100,auVar99);
            auVar8 = vfmadd213ps_fma(auVar93,auVar112,auVar95);
            auVar142 = vfnmadd231ps_fma(auVar94,auVar100,auVar92);
            auVar139 = vfnmadd213ps_fma(auVar55,auVar112,auVar87);
            auVar82 = vfnmadd213ps_fma(auVar56,auVar112,auVar88);
            auVar140 = vfnmadd231ps_fma(auVar95,auVar112,auVar93);
            auVar95 = vsubps_avx512vl(auVar96,ZEXT1632(auVar12));
            auVar93 = vsubps_avx(ZEXT1632(auVar177),ZEXT1632(auVar13));
            auVar90 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar142));
            auVar57._4_4_ = auVar93._4_4_ * auVar142._4_4_;
            auVar57._0_4_ = auVar93._0_4_ * auVar142._0_4_;
            auVar57._8_4_ = auVar93._8_4_ * auVar142._8_4_;
            auVar57._12_4_ = auVar93._12_4_ * auVar142._12_4_;
            auVar57._16_4_ = auVar93._16_4_ * 0.0;
            auVar57._20_4_ = auVar93._20_4_ * 0.0;
            auVar57._24_4_ = auVar93._24_4_ * 0.0;
            auVar57._28_4_ = auVar92._28_4_;
            auVar9 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar13),auVar90);
            auVar58._4_4_ = auVar90._4_4_ * auVar12._4_4_;
            auVar58._0_4_ = auVar90._0_4_ * auVar12._0_4_;
            auVar58._8_4_ = auVar90._8_4_ * auVar12._8_4_;
            auVar58._12_4_ = auVar90._12_4_ * auVar12._12_4_;
            auVar58._16_4_ = auVar90._16_4_ * 0.0;
            auVar58._20_4_ = auVar90._20_4_ * 0.0;
            auVar58._24_4_ = auVar90._24_4_ * 0.0;
            auVar58._28_4_ = auVar90._28_4_;
            auVar10 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar142),auVar95);
            auVar59._4_4_ = auVar13._4_4_ * auVar95._4_4_;
            auVar59._0_4_ = auVar13._0_4_ * auVar95._0_4_;
            auVar59._8_4_ = auVar13._8_4_ * auVar95._8_4_;
            auVar59._12_4_ = auVar13._12_4_ * auVar95._12_4_;
            auVar59._16_4_ = auVar95._16_4_ * 0.0;
            auVar59._20_4_ = auVar95._20_4_ * 0.0;
            auVar59._24_4_ = auVar95._24_4_ * 0.0;
            auVar59._28_4_ = auVar95._28_4_;
            auVar11 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar12),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar113,ZEXT1632(auVar10));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar113,ZEXT1632(auVar9));
            uVar71 = vcmpps_avx512vl(auVar93,auVar113,2);
            bVar69 = (byte)uVar71;
            fVar79 = (float)((uint)(bVar69 & 1) * auVar83._0_4_ |
                            (uint)!(bool)(bVar69 & 1) * auVar139._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar126 = (float)((uint)bVar18 * auVar83._4_4_ | (uint)!bVar18 * auVar139._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar128 = (float)((uint)bVar18 * auVar83._8_4_ | (uint)!bVar18 * auVar139._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar130 = (float)((uint)bVar18 * auVar83._12_4_ | (uint)!bVar18 * auVar139._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar79))));
            fVar80 = (float)((uint)(bVar69 & 1) * auVar81._0_4_ |
                            (uint)!(bool)(bVar69 & 1) * auVar82._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar127 = (float)((uint)bVar18 * auVar81._4_4_ | (uint)!bVar18 * auVar82._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar129 = (float)((uint)bVar18 * auVar81._8_4_ | (uint)!bVar18 * auVar82._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar131 = (float)((uint)bVar18 * auVar81._12_4_ | (uint)!bVar18 * auVar82._12_4_);
            auVar97 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar80))));
            auVar120._0_4_ =
                 (float)((uint)(bVar69 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar140._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar18 * auVar91._4_4_ | (uint)!bVar18 * auVar140._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * auVar140._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar18 * auVar91._12_4_ | (uint)!bVar18 * auVar140._12_4_);
            fVar136 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
            auVar120._16_4_ = fVar136;
            fVar132 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
            auVar120._20_4_ = fVar132;
            fVar158 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
            auVar120._24_4_ = fVar158;
            iVar1 = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
            auVar120._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar12),auVar96);
            auVar121._0_4_ =
                 (uint)(bVar69 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar9._0_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar18 * auVar93._4_4_ | (uint)!bVar18 * auVar9._4_4_;
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar18 * auVar93._8_4_ | (uint)!bVar18 * auVar9._8_4_;
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar18 * auVar93._12_4_ | (uint)!bVar18 * auVar9._12_4_;
            auVar121._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_;
            auVar121._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_;
            auVar121._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_;
            auVar121._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar13),ZEXT1632(auVar177));
            auVar122._0_4_ =
                 (float)((uint)(bVar69 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar83._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar122._4_4_ = (float)((uint)bVar18 * auVar93._4_4_ | (uint)!bVar18 * auVar83._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar122._8_4_ = (float)((uint)bVar18 * auVar93._8_4_ | (uint)!bVar18 * auVar83._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar122._12_4_ =
                 (float)((uint)bVar18 * auVar93._12_4_ | (uint)!bVar18 * auVar83._12_4_);
            fVar161 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_);
            auVar122._16_4_ = fVar161;
            fVar138 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_);
            auVar122._20_4_ = fVar138;
            fVar137 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_);
            auVar122._24_4_ = fVar137;
            auVar122._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar142),ZEXT1632(auVar8));
            auVar123._0_4_ =
                 (float)((uint)(bVar69 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar69 & 1) * auVar81._0_4_);
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar18 * auVar93._4_4_ | (uint)!bVar18 * auVar81._4_4_);
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar18 * auVar93._8_4_ | (uint)!bVar18 * auVar81._8_4_);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar18 * auVar93._12_4_ | (uint)!bVar18 * auVar81._12_4_);
            fVar147 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar93._16_4_);
            auVar123._16_4_ = fVar147;
            fVar163 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar93._20_4_);
            auVar123._20_4_ = fVar163;
            fVar162 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar93._24_4_);
            auVar123._24_4_ = fVar162;
            iVar2 = (uint)(byte)(uVar71 >> 7) * auVar93._28_4_;
            auVar123._28_4_ = iVar2;
            auVar124._0_4_ =
                 (uint)(bVar69 & 1) * (int)auVar12._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar96._0_4_
            ;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar124._4_4_ = (uint)bVar18 * (int)auVar12._4_4_ | (uint)!bVar18 * auVar96._4_4_;
            bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar124._8_4_ = (uint)bVar18 * (int)auVar12._8_4_ | (uint)!bVar18 * auVar96._8_4_;
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar124._12_4_ = (uint)bVar18 * (int)auVar12._12_4_ | (uint)!bVar18 * auVar96._12_4_;
            auVar124._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar96._16_4_;
            auVar124._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar96._20_4_;
            auVar124._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar96._24_4_;
            auVar124._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar96._28_4_;
            bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar20 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar22 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar96 = vsubps_avx512vl(auVar124,auVar101);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar13._12_4_ |
                                                    (uint)!bVar22 * auVar177._12_4_,
                                                    CONCAT48((uint)bVar20 * (int)auVar13._8_4_ |
                                                             (uint)!bVar20 * auVar177._8_4_,
                                                             CONCAT44((uint)bVar18 *
                                                                      (int)auVar13._4_4_ |
                                                                      (uint)!bVar18 * auVar177._4_4_
                                                                      ,(uint)(bVar69 & 1) *
                                                                       (int)auVar13._0_4_ |
                                                                       (uint)!(bool)(bVar69 & 1) *
                                                                       auVar177._0_4_)))),auVar97);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar142._12_4_ |
                                                    (uint)!bVar23 * auVar8._12_4_,
                                                    CONCAT48((uint)bVar21 * (int)auVar142._8_4_ |
                                                             (uint)!bVar21 * auVar8._8_4_,
                                                             CONCAT44((uint)bVar19 *
                                                                      (int)auVar142._4_4_ |
                                                                      (uint)!bVar19 * auVar8._4_4_,
                                                                      (uint)(bVar69 & 1) *
                                                                      (int)auVar142._0_4_ |
                                                                      (uint)!(bool)(bVar69 & 1) *
                                                                      auVar8._0_4_)))),auVar120);
            auVar92 = vsubps_avx(auVar101,auVar121);
            auVar95 = vsubps_avx(auVar97,auVar122);
            auVar94 = vsubps_avx(auVar120,auVar123);
            auVar60._4_4_ = auVar91._4_4_ * fVar126;
            auVar60._0_4_ = auVar91._0_4_ * fVar79;
            auVar60._8_4_ = auVar91._8_4_ * fVar128;
            auVar60._12_4_ = auVar91._12_4_ * fVar130;
            auVar60._16_4_ = auVar91._16_4_ * 0.0;
            auVar60._20_4_ = auVar91._20_4_ * 0.0;
            auVar60._24_4_ = auVar91._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar60,auVar120,auVar96);
            auVar151._0_4_ = fVar80 * auVar96._0_4_;
            auVar151._4_4_ = fVar127 * auVar96._4_4_;
            auVar151._8_4_ = fVar129 * auVar96._8_4_;
            auVar151._12_4_ = fVar131 * auVar96._12_4_;
            auVar151._16_4_ = auVar96._16_4_ * 0.0;
            auVar151._20_4_ = auVar96._20_4_ * 0.0;
            auVar151._24_4_ = auVar96._24_4_ * 0.0;
            auVar151._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar151,auVar101,auVar90);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar113,ZEXT1632(auVar83));
            auVar154._0_4_ = auVar90._0_4_ * auVar120._0_4_;
            auVar154._4_4_ = auVar90._4_4_ * auVar120._4_4_;
            auVar154._8_4_ = auVar90._8_4_ * auVar120._8_4_;
            auVar154._12_4_ = auVar90._12_4_ * auVar120._12_4_;
            auVar154._16_4_ = auVar90._16_4_ * fVar136;
            auVar154._20_4_ = auVar90._20_4_ * fVar132;
            auVar154._24_4_ = auVar90._24_4_ * fVar158;
            auVar154._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar154,auVar97,auVar91);
            auVar98 = vfmadd231ps_avx512vl(auVar93,auVar113,ZEXT1632(auVar83));
            auVar93 = vmulps_avx512vl(auVar94,auVar121);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar123);
            auVar61._4_4_ = auVar95._4_4_ * auVar123._4_4_;
            auVar61._0_4_ = auVar95._0_4_ * auVar123._0_4_;
            auVar61._8_4_ = auVar95._8_4_ * auVar123._8_4_;
            auVar61._12_4_ = auVar95._12_4_ * auVar123._12_4_;
            auVar61._16_4_ = auVar95._16_4_ * fVar147;
            auVar61._20_4_ = auVar95._20_4_ * fVar163;
            auVar61._24_4_ = auVar95._24_4_ * fVar162;
            auVar61._28_4_ = iVar2;
            auVar83 = vfmsub231ps_fma(auVar61,auVar122,auVar94);
            auVar155._0_4_ = auVar122._0_4_ * auVar92._0_4_;
            auVar155._4_4_ = auVar122._4_4_ * auVar92._4_4_;
            auVar155._8_4_ = auVar122._8_4_ * auVar92._8_4_;
            auVar155._12_4_ = auVar122._12_4_ * auVar92._12_4_;
            auVar155._16_4_ = fVar161 * auVar92._16_4_;
            auVar155._20_4_ = fVar138 * auVar92._20_4_;
            auVar155._24_4_ = fVar137 * auVar92._24_4_;
            auVar155._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar155,auVar95,auVar121);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar113,auVar93);
            auVar89 = vfmadd231ps_avx512vl(auVar93,auVar113,ZEXT1632(auVar83));
            auVar93 = vmaxps_avx(auVar98,auVar89);
            uVar24 = vcmpps_avx512vl(auVar93,auVar113,2);
            bVar78 = bVar78 & (byte)uVar24;
            if (bVar78 != 0) {
              auVar62._4_4_ = auVar94._4_4_ * auVar90._4_4_;
              auVar62._0_4_ = auVar94._0_4_ * auVar90._0_4_;
              auVar62._8_4_ = auVar94._8_4_ * auVar90._8_4_;
              auVar62._12_4_ = auVar94._12_4_ * auVar90._12_4_;
              auVar62._16_4_ = auVar94._16_4_ * auVar90._16_4_;
              auVar62._20_4_ = auVar94._20_4_ * auVar90._20_4_;
              auVar62._24_4_ = auVar94._24_4_ * auVar90._24_4_;
              auVar62._28_4_ = auVar93._28_4_;
              auVar177 = vfmsub231ps_fma(auVar62,auVar95,auVar91);
              auVar63._4_4_ = auVar91._4_4_ * auVar92._4_4_;
              auVar63._0_4_ = auVar91._0_4_ * auVar92._0_4_;
              auVar63._8_4_ = auVar91._8_4_ * auVar92._8_4_;
              auVar63._12_4_ = auVar91._12_4_ * auVar92._12_4_;
              auVar63._16_4_ = auVar91._16_4_ * auVar92._16_4_;
              auVar63._20_4_ = auVar91._20_4_ * auVar92._20_4_;
              auVar63._24_4_ = auVar91._24_4_ * auVar92._24_4_;
              auVar63._28_4_ = auVar91._28_4_;
              auVar81 = vfmsub231ps_fma(auVar63,auVar96,auVar94);
              auVar64._4_4_ = auVar95._4_4_ * auVar96._4_4_;
              auVar64._0_4_ = auVar95._0_4_ * auVar96._0_4_;
              auVar64._8_4_ = auVar95._8_4_ * auVar96._8_4_;
              auVar64._12_4_ = auVar95._12_4_ * auVar96._12_4_;
              auVar64._16_4_ = auVar95._16_4_ * auVar96._16_4_;
              auVar64._20_4_ = auVar95._20_4_ * auVar96._20_4_;
              auVar64._24_4_ = auVar95._24_4_ * auVar96._24_4_;
              auVar64._28_4_ = auVar95._28_4_;
              auVar8 = vfmsub231ps_fma(auVar64,auVar92,auVar90);
              auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar8));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar177),auVar113);
              auVar90 = vrcp14ps_avx512vl(auVar93);
              auVar92 = auVar179._0_32_;
              auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar93,auVar92);
              auVar83 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
              auVar65._4_4_ = auVar8._4_4_ * auVar120._4_4_;
              auVar65._0_4_ = auVar8._0_4_ * auVar120._0_4_;
              auVar65._8_4_ = auVar8._8_4_ * auVar120._8_4_;
              auVar65._12_4_ = auVar8._12_4_ * auVar120._12_4_;
              auVar65._16_4_ = fVar136 * 0.0;
              auVar65._20_4_ = fVar132 * 0.0;
              auVar65._24_4_ = fVar158 * 0.0;
              auVar65._28_4_ = iVar1;
              auVar81 = vfmadd231ps_fma(auVar65,auVar97,ZEXT1632(auVar81));
              auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar101,ZEXT1632(auVar177));
              fVar132 = auVar83._0_4_;
              fVar136 = auVar83._4_4_;
              fVar137 = auVar83._8_4_;
              fVar138 = auVar83._12_4_;
              local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar138,
                                             CONCAT48(auVar81._8_4_ * fVar137,
                                                      CONCAT44(auVar81._4_4_ * fVar136,
                                                               auVar81._0_4_ * fVar132))));
              uVar24 = vcmpps_avx512vl(local_220,local_2e0,0xd);
              fVar158 = local_558->tfar;
              auVar30._4_4_ = fVar158;
              auVar30._0_4_ = fVar158;
              auVar30._8_4_ = fVar158;
              auVar30._12_4_ = fVar158;
              auVar30._16_4_ = fVar158;
              auVar30._20_4_ = fVar158;
              auVar30._24_4_ = fVar158;
              auVar30._28_4_ = fVar158;
              uVar25 = vcmpps_avx512vl(local_220,auVar30,2);
              bVar78 = (byte)uVar24 & (byte)uVar25 & bVar78;
              if (bVar78 != 0) {
                uVar24 = vcmpps_avx512vl(auVar93,auVar113,4);
                bVar78 = bVar78 & (byte)uVar24;
                auVar176 = ZEXT3264(local_340);
                if (bVar78 != 0) {
                  fVar158 = auVar98._0_4_ * fVar132;
                  fVar161 = auVar98._4_4_ * fVar136;
                  auVar66._4_4_ = fVar161;
                  auVar66._0_4_ = fVar158;
                  fVar162 = auVar98._8_4_ * fVar137;
                  auVar66._8_4_ = fVar162;
                  fVar163 = auVar98._12_4_ * fVar138;
                  auVar66._12_4_ = fVar163;
                  fVar147 = auVar98._16_4_ * 0.0;
                  auVar66._16_4_ = fVar147;
                  fVar79 = auVar98._20_4_ * 0.0;
                  auVar66._20_4_ = fVar79;
                  fVar80 = auVar98._24_4_ * 0.0;
                  auVar66._24_4_ = fVar80;
                  auVar66._28_4_ = auVar93._28_4_;
                  auVar90 = vsubps_avx512vl(auVar92,auVar66);
                  local_260._0_4_ =
                       (float)((uint)(bVar69 & 1) * (int)fVar158 |
                              (uint)!(bool)(bVar69 & 1) * auVar90._0_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
                  local_260._4_4_ =
                       (float)((uint)bVar18 * (int)fVar161 | (uint)!bVar18 * auVar90._4_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
                  local_260._8_4_ =
                       (float)((uint)bVar18 * (int)fVar162 | (uint)!bVar18 * auVar90._8_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
                  local_260._12_4_ =
                       (float)((uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar90._12_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
                  local_260._16_4_ =
                       (float)((uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar90._16_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
                  local_260._20_4_ =
                       (float)((uint)bVar18 * (int)fVar79 | (uint)!bVar18 * auVar90._20_4_);
                  bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
                  local_260._24_4_ =
                       (float)((uint)bVar18 * (int)fVar80 | (uint)!bVar18 * auVar90._24_4_);
                  bVar18 = SUB81(uVar71 >> 7,0);
                  local_260._28_4_ =
                       (float)((uint)bVar18 * auVar93._28_4_ | (uint)!bVar18 * auVar90._28_4_);
                  auVar93 = vsubps_avx(auVar112,auVar100);
                  auVar83 = vfmadd213ps_fma(auVar93,local_260,auVar100);
                  fVar158 = local_538->depth_scale;
                  auVar31._4_4_ = fVar158;
                  auVar31._0_4_ = fVar158;
                  auVar31._8_4_ = fVar158;
                  auVar31._12_4_ = fVar158;
                  auVar31._16_4_ = fVar158;
                  auVar31._20_4_ = fVar158;
                  auVar31._24_4_ = fVar158;
                  auVar31._28_4_ = fVar158;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                               CONCAT48(auVar83._8_4_ +
                                                                        auVar83._8_4_,
                                                                        CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                            auVar31);
                  uVar24 = vcmpps_avx512vl(local_220,auVar93,6);
                  if (((byte)uVar24 & bVar78) != 0) {
                    auVar7._0_4_ = local_558->tfar;
                    auVar7._4_4_ = local_558->mask;
                    auVar7._8_4_ = local_558->id;
                    auVar7._12_4_ = local_558->flags;
                    uVar70 = vextractps_avx(auVar7,1);
                    auVar141._0_4_ = auVar89._0_4_ * fVar132;
                    auVar141._4_4_ = auVar89._4_4_ * fVar136;
                    auVar141._8_4_ = auVar89._8_4_ * fVar137;
                    auVar141._12_4_ = auVar89._12_4_ * fVar138;
                    auVar141._16_4_ = auVar89._16_4_ * 0.0;
                    auVar141._20_4_ = auVar89._20_4_ * 0.0;
                    auVar141._24_4_ = auVar89._24_4_ * 0.0;
                    auVar141._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar92,auVar141);
                    auVar125._0_4_ =
                         (uint)(bVar69 & 1) * (int)auVar141._0_4_ |
                         (uint)!(bool)(bVar69 & 1) * auVar93._0_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar18 * (int)auVar141._4_4_ | (uint)!bVar18 * auVar93._4_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar18 * (int)auVar141._8_4_ | (uint)!bVar18 * auVar93._8_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar18 * (int)auVar141._12_4_ | (uint)!bVar18 * auVar93._12_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar18 * (int)auVar141._16_4_ | (uint)!bVar18 * auVar93._16_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar18 * (int)auVar141._20_4_ | (uint)!bVar18 * auVar93._20_4_;
                    bVar18 = (bool)((byte)(uVar71 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar18 * (int)auVar141._24_4_ | (uint)!bVar18 * auVar93._24_4_;
                    auVar125._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar93._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_240 = vfmsub132ps_avx512vl(auVar125,auVar92,auVar32);
                    local_200 = (int)lVar75;
                    local_1fc = iVar15;
                    local_1f0 = local_4a0._0_8_;
                    uStack_1e8 = local_4a0._8_8_;
                    local_1e0 = local_490._0_8_;
                    uStack_1d8 = local_490._8_8_;
                    local_1d0 = local_4b0._0_8_;
                    uStack_1c8 = local_4b0._8_8_;
                    pGVar16 = (context->scene->geometries).items[local_540].ptr;
                    if ((pGVar16->mask & uVar70) == 0) {
                      bVar69 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar69 = 1, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar83 = vcvtsi2ss_avx512f(auVar178._0_16_,(int)lVar75);
                      fVar158 = auVar83._0_4_;
                      local_1a0[0] = (fVar158 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                      local_1a0[1] = (fVar158 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                      local_1a0[2] = (fVar158 + local_260._8_4_ + 2.0) * fStack_2f8;
                      local_1a0[3] = (fVar158 + local_260._12_4_ + 3.0) * fStack_2f4;
                      fStack_190 = (fVar158 + local_260._16_4_ + 4.0) * fStack_2f0;
                      fStack_18c = (fVar158 + local_260._20_4_ + 5.0) * fStack_2ec;
                      fStack_188 = (fVar158 + local_260._24_4_ + 6.0) * fStack_2e8;
                      fStack_184 = fVar158 + local_260._28_4_ + 7.0;
                      local_180 = local_240;
                      local_160 = local_220;
                      uVar71 = (ulong)((byte)uVar24 & bVar78);
                      local_548 = uVar71;
                      lVar72 = 0;
                      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                        lVar72 = lVar72 + 1;
                      }
                      local_4c0 = context;
                      local_270 = auVar7;
                      local_4c8 = pGVar16;
                      do {
                        auVar177 = auVar178._0_16_;
                        local_4f4 = local_1a0[lVar72];
                        local_4f0 = *(undefined4 *)(local_180 + lVar72 * 4);
                        local_450._0_8_ = lVar72;
                        local_558->tfar = *(float *)(local_160 + lVar72 * 4);
                        local_530.context = local_4c0->user;
                        fVar132 = 1.0 - local_4f4;
                        fVar158 = fVar132 * fVar132 * -3.0;
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar132)),
                                                  ZEXT416((uint)(local_4f4 * fVar132)),
                                                  ZEXT416(0xc0000000));
                        auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_4f4 * fVar132)),
                                                  ZEXT416((uint)(local_4f4 * local_4f4)),
                                                  ZEXT416(0x40000000));
                        fVar132 = auVar83._0_4_ * 3.0;
                        fVar136 = auVar81._0_4_ * 3.0;
                        fVar137 = local_4f4 * local_4f4 * 3.0;
                        auVar157._0_4_ = fVar137 * (float)local_310._0_4_;
                        auVar157._4_4_ = fVar137 * (float)local_310._4_4_;
                        auVar157._8_4_ = fVar137 * fStack_308;
                        auVar157._12_4_ = fVar137 * fStack_304;
                        auVar144._4_4_ = fVar136;
                        auVar144._0_4_ = fVar136;
                        auVar144._8_4_ = fVar136;
                        auVar144._12_4_ = fVar136;
                        auVar83 = vfmadd132ps_fma(auVar144,auVar157,local_4b0);
                        auVar149._4_4_ = fVar132;
                        auVar149._0_4_ = fVar132;
                        auVar149._8_4_ = fVar132;
                        auVar149._12_4_ = fVar132;
                        auVar83 = vfmadd132ps_fma(auVar149,auVar83,local_490);
                        auVar145._4_4_ = fVar158;
                        auVar145._0_4_ = fVar158;
                        auVar145._8_4_ = fVar158;
                        auVar145._12_4_ = fVar158;
                        auVar83 = vfmadd132ps_fma(auVar145,auVar83,local_4a0);
                        local_500 = vmovlps_avx(auVar83);
                        local_4f8 = vextractps_avx(auVar83,2);
                        local_4ec = (int)local_4b8;
                        local_4e8 = (int)local_540;
                        local_4e4 = (local_530.context)->instID[0];
                        local_4e0 = (local_530.context)->instPrimID[0];
                        local_55c = -1;
                        local_530.valid = &local_55c;
                        local_530.geometryUserPtr = local_4c8->userPtr;
                        local_530.ray = (RTCRayN *)local_558;
                        local_530.hit = (RTCHitN *)&local_500;
                        local_530.N = 1;
                        if ((local_4c8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_4c8->occlusionFilterN)(&local_530), *local_530.valid != 0)) {
                          p_Var17 = local_4c0->args->filter;
                          if ((p_Var17 == (RTCFilterFunctionN)0x0) ||
                             ((((local_4c0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_4c8->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var17)(&local_530), *local_530.valid != 0)))) {
                            bVar69 = 1;
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar179 = ZEXT3264(auVar93);
                            auVar83 = vxorps_avx512vl(auVar177,auVar177);
                            auVar178 = ZEXT1664(auVar83);
                            auVar176 = ZEXT3264(local_340);
                            auVar187 = ZEXT3264(local_360);
                            auVar185 = ZEXT3264(local_400);
                            auVar184 = ZEXT3264(local_380);
                            auVar182 = ZEXT3264(local_420);
                            auVar188 = ZEXT3264(local_440);
                            auVar183 = ZEXT3264(local_3a0);
                            auVar186 = ZEXT3264(local_3c0);
                            auVar180 = ZEXT3264(local_3e0);
                            auVar181 = ZEXT3264(local_480);
                            context = local_4c0;
                            break;
                          }
                        }
                        local_558->tfar = (float)local_270._0_4_;
                        local_548 = local_548 ^ 1L << (local_450._0_8_ & 0x3f);
                        bVar69 = 0;
                        lVar72 = 0;
                        for (uVar71 = local_548; (uVar71 & 1) == 0;
                            uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                          lVar72 = lVar72 + 1;
                        }
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar179 = ZEXT3264(auVar93);
                        auVar83 = vxorps_avx512vl(auVar177,auVar177);
                        auVar178 = ZEXT1664(auVar83);
                        auVar176 = ZEXT3264(local_340);
                        auVar187 = ZEXT3264(local_360);
                        auVar185 = ZEXT3264(local_400);
                        auVar184 = ZEXT3264(local_380);
                        auVar182 = ZEXT3264(local_420);
                        auVar188 = ZEXT3264(local_440);
                        auVar183 = ZEXT3264(local_3a0);
                        auVar186 = ZEXT3264(local_3c0);
                        auVar180 = ZEXT3264(local_3e0);
                        auVar181 = ZEXT3264(local_480);
                        context = local_4c0;
                      } while (local_548 != 0);
                    }
                    bVar77 = (bool)(bVar77 | bVar69);
                  }
                }
                goto LAB_01ceda45;
              }
            }
            auVar176 = ZEXT3264(local_340);
          }
LAB_01ceda45:
          lVar75 = lVar75 + 8;
        } while ((int)lVar75 < iVar15);
      }
      if (bVar77) {
        return bVar77;
      }
      fVar158 = local_558->tfar;
      auVar29._4_4_ = fVar158;
      auVar29._0_4_ = fVar158;
      auVar29._8_4_ = fVar158;
      auVar29._12_4_ = fVar158;
      auVar29._16_4_ = fVar158;
      auVar29._20_4_ = fVar158;
      auVar29._24_4_ = fVar158;
      auVar29._28_4_ = fVar158;
      uVar24 = vcmpps_avx512vl(local_80,auVar29,2);
      uVar70 = (uint)uVar76 & (uint)uVar76 + 0xff & (uint)uVar24;
      uVar76 = (ulong)uVar70;
    } while (uVar70 != 0);
  }
  return bVar77;
}

Assistant:

static __forceinline bool occluded_h(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }